

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::FragmentOutputCase::iterate(FragmentOutputCase *this)

{
  qpTestLog **ppqVar1;
  undefined1 (*pauVar2) [16];
  ostringstream *poVar3;
  DataType DVar4;
  pointer pBVar5;
  pointer pFVar6;
  pointer puVar7;
  pointer puVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  IVec4 *pIVar16;
  Vec4 VVar17;
  pointer pAVar18;
  _func_int **pp_Var19;
  bool bVar20;
  int iVar21;
  TextureChannelClass TVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  deUint32 dVar26;
  int iVar27;
  const_iterator i;
  undefined4 extraout_var;
  pointer pBVar28;
  pointer pFVar29;
  TextureFormat TVar30;
  pointer pfVar31;
  ostream *poVar32;
  ostringstream *poVar33;
  TextureFormat *pTVar34;
  undefined8 *puVar35;
  long *plVar36;
  TransferFormat TVar37;
  long lVar38;
  float *pfVar39;
  TestError *pTVar40;
  byte bVar41;
  int i_6;
  ulong uVar42;
  ostringstream *poVar43;
  MessageBuilder *pMVar44;
  float *pfVar45;
  int i_3;
  ChannelOrder CVar46;
  int iVar47;
  char *description;
  int i_2;
  ulong uVar48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  long lVar49;
  uint uVar50;
  qpTestResult testResult;
  ulong uVar51;
  pointer puVar52;
  ostringstream *poVar53;
  qpTestLog **ppqVar54;
  MessageBuilder *pMVar55;
  float *pfVar56;
  pointer pfVar57;
  qpTestLog *pqVar58;
  TestLog TVar59;
  unsigned_short uVar60;
  int x;
  unsigned_short uVar61;
  MessageBuilder *this_01;
  int iVar62;
  ChannelType CVar63;
  size_type sVar64;
  int iVar65;
  ulong uVar66;
  pointer format;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  float fVar70;
  float fVar71;
  float fVar82;
  float fVar83;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar84;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar85;
  float fVar93;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float afVar92 [4];
  float fVar94;
  float fVar98;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar99;
  uint uVar100;
  uint uVar101;
  uint uVar102;
  uint uVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  Vec4 maxVal;
  TextureFormat readFmt;
  Vec4 minVal;
  IVec4 minVal_1;
  BVec4 isZero;
  IVec4 step;
  IVec4 rangeDiv;
  IVec4 maxVal_1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  inputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> drawBuffers;
  TextureFormat texFmt;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  vector<float,_std::allocator<float>_> positions;
  Vector<int,_4> res_6;
  TextureFormat refFmt;
  Vec4 local_5e8;
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [8];
  TextureFormat TStack_5c0;
  qpTestLog *local_5b8;
  TextureFormat TStack_5b0;
  IVec4 local_598;
  undefined1 local_588 [16];
  Vec4 local_578;
  qpTestLog *local_568;
  undefined8 uStack_560;
  ulong local_550;
  uint local_544;
  ulong local_540;
  long local_538;
  ulong local_530;
  float local_528;
  float local_524;
  ulong local_520;
  undefined1 local_518 [16];
  pointer local_500;
  ulong local_4f8;
  int local_4f0;
  int local_4ec;
  undefined8 local_4e8;
  float fStack_4e0;
  float fStack_4dc;
  ulong local_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [16];
  TestLog local_498 [2];
  TestLog *local_488;
  long local_480;
  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  local_478;
  undefined8 local_458;
  float fStack_450;
  float fStack_44c;
  TextureFormat local_448;
  _func_int **pp_Stack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  ulong local_428 [2];
  undefined1 local_418 [12];
  float fStack_40c;
  ulong local_408 [2];
  pointer local_3f8;
  size_type local_3f0;
  pointer local_3e8;
  uint local_3e0;
  uint local_3dc;
  int local_3d8;
  uint local_3d4;
  ulong local_3d0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_3c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3b0;
  undefined1 local_398 [8];
  undefined8 uStack_390;
  Vec4 local_388;
  ios_base local_328 [8];
  ios_base local_320 [264];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_218;
  vector<float,_std::allocator<float>_> local_200;
  float local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  long local_1d8;
  ulong local_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  ios_base local_158 [272];
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  local_488 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar21 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_538 = CONCAT44(extraout_var,iVar21);
  pBVar28 = (this->m_fboSpec).
            super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar5 = (this->m_fboSpec).
           super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pBVar28 == pBVar5) {
    local_4ec = 0x7fffffff;
    uVar48 = 0xff;
    iVar21 = 0x100;
    local_4f0 = 0x7fffffff;
    uVar42 = 0xff;
  }
  else {
    uVar51 = 0x7fffffff;
    uVar66 = 0x7fffffff;
    do {
      uVar48 = (ulong)(uint)pBVar28->width;
      if ((int)uVar66 < pBVar28->width) {
        uVar48 = uVar66;
      }
      local_4ec = (int)uVar48;
      uVar42 = (ulong)(uint)pBVar28->height;
      if ((int)uVar51 < pBVar28->height) {
        uVar42 = uVar51;
      }
      local_4f0 = (int)uVar42;
      pBVar28 = pBVar28 + 1;
      uVar51 = uVar42;
      uVar66 = uVar48;
    } while (pBVar28 != pBVar5);
    uVar48 = uVar48 >> 3;
    if (0xfe < (uint)uVar48) {
      uVar48 = 0xff;
    }
    if (local_4ec < 8) {
      uVar48 = 1;
    }
    uVar42 = uVar42 >> 3;
    if (0xfe < (uint)uVar42) {
      uVar42 = 0xff;
    }
    iVar21 = (int)uVar48 + 1;
    if (local_4f0 < 8) {
      uVar42 = 1;
    }
  }
  iVar24 = (int)uVar42;
  local_3d0 = (ulong)((iVar24 + 1U) * iVar21);
  pFVar29 = (this->m_outputs).
            super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar6 = (this->m_outputs).
           super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar51 = 0;
  if (pFVar29 != pFVar6) {
    do {
      iVar65 = pFVar29->arrayLength;
      if (iVar65 < 2) {
        iVar65 = 1;
      }
      uVar50 = (int)uVar51 + iVar65;
      uVar51 = (ulong)uVar50;
      pFVar29 = pFVar29 + 1;
    } while (pFVar29 != pFVar6);
    uVar51 = (ulong)(int)uVar50;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_3c8,uVar51,(allocator_type *)local_398);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_200,(ulong)(uint)((int)local_3d0 * 4),(allocator_type *)local_398);
  local_3e0 = iVar24 * (int)uVar48;
  local_550 = (ulong)local_3e0;
  local_3e0 = local_3e0 * 6;
  local_530 = uVar48;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_218,(ulong)local_3e0,(allocator_type *)local_398);
  uVar48 = (long)(this->m_fboSpec).
                 super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_fboSpec).
                 super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar66 = uVar48 >> 4;
  uVar50 = (uint)uVar66;
  uVar51 = (ulong)(int)uVar50;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_3b0,uVar51,(allocator_type *)local_398);
  if (0x199999999999999 < uVar51) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  local_518._0_4_ = iVar21;
  if ((uVar48 & 0xfffffffff) == 0) {
    local_478.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_478.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_478.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    local_478.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(uVar51 * 0x50);
    local_478.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_478.
         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
         ._M_impl.super__Vector_impl_data._M_start + uVar51;
    local_478.
    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_478.
         super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
         ._M_impl.super__Vector_impl_data._M_start;
    do {
      (local_478.
       super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
       ._M_impl.super__Vector_impl_data._M_finish)->numWrittenChannels = 0;
      (local_478.
       super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
       ._M_impl.super__Vector_impl_data._M_finish)->outPrecision = PRECISION_LOWP;
      ((local_478.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
        ._M_impl.super__Vector_impl_data._M_finish)->format).order = CHANNELORDER_LAST;
      ((local_478.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
        ._M_impl.super__Vector_impl_data._M_finish)->format).type = CHANNELTYPE_LAST;
      ((local_478.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
        ._M_impl.super__Vector_impl_data._M_finish)->referenceFormat).order = CHANNELORDER_LAST;
      ((local_478.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
        ._M_impl.super__Vector_impl_data._M_finish)->referenceFormat).type = CHANNELTYPE_LAST;
      ((local_478.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
        ._M_impl.super__Vector_impl_data._M_finish)->readFormat).order = CHANNELORDER_LAST;
      ((local_478.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
        ._M_impl.super__Vector_impl_data._M_finish)->readFormat).type = CHANNELTYPE_LAST;
      ((local_478.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
        ._M_impl.super__Vector_impl_data._M_finish)->renderedData).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ((local_478.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
        ._M_impl.super__Vector_impl_data._M_finish)->renderedData).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined1 (*) [16])
       &((local_478.
          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
          ._M_impl.super__Vector_impl_data._M_finish)->renderedData).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
      ((local_478.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
        ._M_impl.super__Vector_impl_data._M_finish)->referenceData).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ((local_478.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
        ._M_impl.super__Vector_impl_data._M_finish)->referenceData).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_478.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_478.
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      uVar51 = uVar51 - 1;
    } while (uVar51 != 0);
  }
  local_520 = uVar42;
  local_4d0 = uVar66;
  if (0 < (int)uVar50) {
    this_00 = &(local_478.
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                ._M_impl.super__Vector_impl_data._M_start)->referenceData;
    lVar49 = 0;
    uVar48 = 0;
    do {
      TVar30 = glu::mapGLInternalFormat
                         (*(deUint32 *)
                           ((long)&((this->m_fboSpec).
                                    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->format + lVar49));
      local_398._0_4_ = TVar30.order;
      local_398._4_4_ = TVar30.type;
      TVar22 = tcu::getTextureChannelClass(TVar30.type);
      if (TVar22 < TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        local_1c8._4_4_ = FLOAT;
        local_1c8._0_4_ = local_398._0_4_;
      }
      else {
        local_1c8._0_8_ = local_398;
      }
      local_1c8._0_4_ = (ChannelOrder)local_1c8._0_8_;
      local_1c8._4_4_ = SUB84(local_1c8._0_8_,4);
      local_5c8 = (undefined1  [8])FboTestUtil::getFramebufferReadFormat((TextureFormat *)local_398)
      ;
      auVar79 = local_1c8;
      pBVar28 = (this->m_fboSpec).
                super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar21 = *(int *)((long)&pBVar28->width + lVar49);
      iVar65 = *(int *)((long)&pBVar28->height + lVar49);
      local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar48] = (int)uVar48 + 0x8ce0;
      this_00[-3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_398;
      *(undefined1 (*) [8])&((TextureFormat *)(this_00 + -2))[1].order = local_5c8;
      *(ChannelOrder *)
       &this_00[-2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_1c8._0_4_;
      *(undefined4 *)
       ((long)&this_00[-2].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start + 4) = local_1c8._4_4_;
      local_1c8 = auVar79;
      iVar23 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_5c8);
      iVar65 = iVar65 * iVar21;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (this_00 + -1,(long)(iVar23 * iVar65));
      iVar21 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_1c8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (this_00,(long)(iVar65 * iVar21));
      uVar48 = uVar48 + 1;
      this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                &this_00[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      lVar49 = lVar49 + 0x10;
    } while ((uVar50 & 0x7fffffff) != uVar48);
  }
  uVar48 = (ulong)(uint)local_518._0_4_;
  if ((int)local_550 != 0) {
    puVar52 = local_218.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start + 5;
    uVar42 = 0;
    do {
      sVar11 = (short)((uVar42 & 0xffffffff) / (local_530 & 0xffffffff));
      sVar10 = sVar11 * local_518._0_2_;
      sVar9 = (short)((uVar42 & 0xffffffff) % (local_530 & 0xffffffff));
      puVar52[-5] = sVar9 + sVar10;
      sVar11 = (sVar11 + 1) * local_518._0_2_;
      uVar61 = sVar9 + sVar11;
      puVar52[-4] = uVar61;
      uVar60 = sVar10 + sVar9 + 1;
      puVar52[-3] = uVar60;
      puVar52[-2] = uVar61;
      puVar52[-1] = sVar11 + sVar9 + 1;
      *puVar52 = uVar60;
      uVar42 = uVar42 + 1;
      puVar52 = puVar52 + 6;
    } while ((local_550 & 0xffffffff) != uVar42);
  }
  local_524 = (float)(int)local_530;
  local_528 = (float)(int)local_520;
  pfVar31 = local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + 2;
  uVar42 = 0;
  do {
    fVar94 = (float)(int)uVar42 / local_528;
    uVar51 = 0;
    pfVar57 = pfVar31;
    do {
      fVar99 = (float)(int)uVar51 / local_524;
      pfVar57[-2] = fVar99 + fVar99 + -1.0;
      pfVar57[-1] = fVar94 + fVar94 + -1.0;
      pfVar57[0] = 0.0;
      pfVar57[1] = 1.0;
      uVar51 = uVar51 + 1;
      pfVar57 = pfVar57 + 4;
    } while (uVar48 != uVar51);
    uVar42 = uVar42 + 1;
    pfVar31 = pfVar31 + uVar48 * 4;
  } while (uVar42 != iVar24 + 1U);
  pFVar29 = (this->m_outputs).
            super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_550 = uVar48;
  if (0 < (int)((ulong)((long)(this->m_outputs).
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar29) >> 4)) {
    local_48 = local_518._0_4_ - 1;
    iStack_40 = local_518._0_4_ - 1;
    lVar49 = 0;
    local_540 = 0;
    uVar48 = local_520;
    iStack_44 = iVar24;
    iStack_3c = iVar24;
    do {
      DVar4 = pFVar29[lVar49].type;
      iVar21 = pFVar29[lVar49].arrayLength;
      local_1d8 = lVar49;
      uVar50 = glu::getDataTypeScalarSize(DVar4);
      pFVar29 = pFVar29 + lVar49;
      local_3d4 = DVar4 - TYPE_FLOAT;
      local_3dc = DVar4 - TYPE_INT;
      local_1d0 = (ulong)(DVar4 - TYPE_UINT);
      local_3f0 = (size_type)(int)(uVar50 * (int)local_3d0);
      local_480 = (long)(int)uVar50;
      local_4f8 = CONCAT44(local_4f8._4_4_,(int)local_550 * uVar50);
      local_518._0_8_ = (ulong)uVar50 << 2;
      local_3d8 = iVar21;
      if (iVar21 < 2) {
        local_3d8 = 1;
      }
      local_500 = (pointer)((ulong)local_500 & 0xffffffff00000000);
      uVar42 = local_540;
      local_3f8 = pFVar29;
      do {
        local_4c8 = (TestLog *)((long)(int)uVar42 * 3);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (local_3c8.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)uVar42,local_3f0);
        iVar21 = (int)local_500;
        iVar24 = pFVar29->location + (int)local_500;
        local_478.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar24].numWrittenChannels = uVar50;
        uVar51 = (ulong)pFVar29->precision;
        local_478.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar24].outPrecision = pFVar29->precision;
        local_540 = uVar42;
        if (local_3d4 < 4) {
          if (getFloatRange(glu::Precision)::ranges == '\0') {
            iterate();
          }
          uVar48 = local_540;
          local_598.m_data[1] = *(int *)(getFloatRange(glu::Precision)::ranges + uVar51 * 8);
          local_5e8.m_data[1] = *(float *)(getFloatRange(glu::Precision)::ranges + uVar51 * 8 + 4);
          local_598.m_data[0] = local_598.m_data[1];
          local_598.m_data[2] = local_598.m_data[1];
          local_598.m_data[3] = local_598.m_data[1];
          local_5e8.m_data[0] = local_5e8.m_data[1];
          local_5e8.m_data[2] = local_5e8.m_data[1];
          local_5e8.m_data[3] = local_5e8.m_data[1];
          local_448 = *(TextureFormat *)
                       (&((local_3c8.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start + (long)local_4c8);
          uVar25 = pFVar29->location + iVar21;
          poVar3 = (ostringstream *)(local_398 + 8);
          if ((-1 < (int)uVar25) &&
             ((int)uVar25 <
              (int)((ulong)((long)local_478.
                                  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_478.
                                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333)) {
            tcu::getTextureFormatInfo
                      ((TextureFormatInfo *)local_398,
                       &local_478.
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar25].format);
            pp_Var19 = uStack_390;
            local_598.m_data[1] =
                 ~-(uint)((float)local_398._4_4_ <= (float)local_598.m_data[1]) & local_398._4_4_ |
                 local_598.m_data[1] & -(uint)((float)local_398._4_4_ <= (float)local_598.m_data[1])
            ;
            local_598.m_data[0] =
                 ~-(uint)((float)local_398._0_4_ <= (float)local_598.m_data[0]) & local_398._0_4_ |
                 local_598.m_data[0] & -(uint)((float)local_398._0_4_ <= (float)local_598.m_data[0])
            ;
            local_598.m_data[2] =
                 ~-(uint)((float)uStack_390 <= (float)local_598.m_data[2]) & (uint)(float)uStack_390
                 | local_598.m_data[2] & -(uint)((float)uStack_390 <= (float)local_598.m_data[2]);
            local_598.m_data[3] =
                 ~-(uint)(uStack_390._4_4_ <= (float)local_598.m_data[3]) & (uint)uStack_390._4_4_ |
                 local_598.m_data[3] & -(uint)(uStack_390._4_4_ <= (float)local_598.m_data[3]);
            uVar25 = -(uint)(local_5e8.m_data[0] <= local_388.m_data[0]);
            uVar67 = -(uint)(local_5e8.m_data[1] <= local_388.m_data[1]);
            uVar68 = -(uint)(local_5e8.m_data[2] <= local_388.m_data[2]);
            uVar69 = -(uint)(local_5e8.m_data[3] <= local_388.m_data[3]);
            local_5e8.m_data[1] =
                 (float)(~uVar67 & (uint)local_388.m_data[1] | (uint)local_5e8.m_data[1] & uVar67);
            local_5e8.m_data[0] =
                 (float)(~uVar25 & (uint)local_388.m_data[0] | (uint)local_5e8.m_data[0] & uVar25);
            local_5e8.m_data[2] =
                 (float)(~uVar68 & (uint)local_388.m_data[2] | (uint)local_5e8.m_data[2] & uVar68);
            local_5e8.m_data[3] =
                 (float)(~uVar69 & (uint)local_388.m_data[3] | (uint)local_5e8.m_data[3] & uVar69);
            uStack_390 = pp_Var19;
          }
          local_398 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"out",3);
          std::ostream::operator<<(poVar3,(int)uVar48);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," value range: ",0xe)
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"(",1);
          lVar49 = 0;
          do {
            if (lVar49 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,", ",2);
            }
            if (lVar49 < local_480) {
              poVar32 = std::ostream::_M_insert<double>((double)(float)local_598.m_data[lVar49]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar32," -> ",4);
              std::ostream::_M_insert<double>((double)local_5e8.m_data[lVar49]);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Undef",5);
            }
            lVar49 = lVar49 + 1;
          } while (lVar49 != 4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,")",1);
          uVar48 = local_540;
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
          std::ios_base::~ios_base(local_158);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_5c8,(long)TStack_5c0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if (local_5c8 != (undefined1  [8])&local_5b8) {
            operator_delete((void *)local_5c8,(ulong)((long)&local_5b8->flags + 1));
          }
          std::__cxx11::ostringstream::~ostringstream(poVar3);
          std::ios_base::~ios_base(local_320);
          uVar25 = (uint)uVar48;
          uVar67 = uVar25 + 7;
          if (-1 < (int)uVar25) {
            uVar67 = uVar25;
          }
          lVar49 = (long)(int)(uVar25 - (uVar67 & 0xfffffff8)) * 0x10;
          iVar21 = *(int *)(s_swizzles + lVar49);
          iVar24 = *(int *)(s_swizzles + lVar49 + 4);
          iVar65 = *(int *)(s_swizzles + lVar49 + 8);
          iVar23 = *(int *)(s_swizzles + lVar49 + 0xc);
          local_4b8 = local_598.m_data._0_8_;
          fStack_4b0 = (float)local_598.m_data[2];
          fStack_4ac = (float)local_598.m_data[3];
          local_4e8 = (pointer)CONCAT44(local_5e8.m_data[1] - (float)local_598.m_data[1],
                                        local_5e8.m_data[0] - (float)local_598.m_data[0]);
          fStack_4e0 = local_5e8.m_data[2] - (float)local_598.m_data[2];
          fStack_4dc = local_5e8.m_data[3] - (float)local_598.m_data[3];
          iVar62 = 0;
          uVar48 = 0;
          do {
            local_458 = uVar48;
            fVar94 = (float)(int)uVar48 / local_528;
            local_4c8 = (TestLog *)CONCAT44(local_4c8._4_4_,iVar62);
            uVar42 = 0;
            uVar48 = local_550;
            do {
              fVar99 = (float)(int)uVar42 / local_524;
              local_398._0_4_ = (fVar94 + fVar99) * 0.5;
              local_398._4_4_ = (fVar99 - fVar94) * 0.5 + 0.5;
              uStack_390._4_4_ = 1.0 - (float)local_398._4_4_;
              uStack_390._0_4_ = 1.0 - (float)local_398._0_4_;
              local_398._0_4_ =
                   *(float *)(local_398 + (long)iVar21 * 4) * (float)local_4e8 + (float)local_4b8;
              local_398._4_4_ =
                   *(float *)(local_398 + (long)iVar24 * 4) * local_4e8._4_4_ + local_4b8._4_4_;
              uStack_390._0_4_ = *(float *)(local_398 + (long)iVar65 * 4) * fStack_4e0 + fStack_4b0;
              uStack_390._4_4_ = *(float *)(local_398 + (long)iVar23 * 4) * fStack_4dc + fStack_4ac;
              if (0 < (int)uVar50) {
                memcpy((pointer)((long)local_448 + (long)iVar62 * 4),local_398,local_518._0_8_);
                uVar48 = local_550;
              }
              uVar42 = uVar42 + 1;
              iVar62 = iVar62 + uVar50;
            } while (uVar48 != uVar42);
            uVar48 = (ulong)((int)local_458 + 1);
            iVar62 = (int)(float)local_4c8 + (uint)local_4f8;
          } while ((int)local_458 != (int)local_520);
LAB_012b9658:
          uVar48 = local_520;
          pFVar29 = local_3f8;
        }
        else {
          if (local_3dc < 4) {
            if (getIntRange(glu::Precision)::ranges == '\0') {
              iterate();
            }
            uVar42 = local_540;
            local_578.m_data[1] = *(float *)(getIntRange(glu::Precision)::ranges + uVar51 * 8);
            local_418._4_4_ = *(undefined4 *)(getIntRange(glu::Precision)::ranges + uVar51 * 8 + 4);
            local_578.m_data[0] = local_578.m_data[1];
            local_578.m_data[2] = local_578.m_data[1];
            local_578.m_data[3] = local_578.m_data[1];
            local_418._0_4_ = local_418._4_4_;
            local_418._8_4_ = local_418._4_4_;
            fStack_40c = (float)local_418._4_4_;
            uVar25 = pFVar29->location + iVar21;
            poVar3 = (ostringstream *)(local_398 + 8);
            if ((-1 < (int)uVar25) &&
               ((int)uVar25 <
                (int)((ulong)((long)local_478.
                                    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_478.
                                   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333))
            {
              tcu::getTextureFormatBitDepth
                        ((tcu *)&local_5e8,
                         &local_478.
                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar25].format);
              auVar79._0_4_ = -(uint)(0 < (int)local_5e8.m_data[0]);
              auVar79._4_4_ = -(uint)(0 < (int)local_5e8.m_data[1]);
              auVar79._8_4_ = -(uint)(0 < (int)local_5e8.m_data[2]);
              auVar79._12_4_ = -(uint)(0 < (int)local_5e8.m_data[3]);
              auVar79 = packssdw(auVar79,auVar79);
              auVar95._8_4_ = 0xffffffff;
              auVar95._0_8_ = 0xffffffffffffffff;
              auVar95._12_4_ = 0xffffffff;
              auVar79 = packsswb(auVar79 ^ auVar95,auVar79 ^ auVar95);
              local_544 = auVar79._0_4_ & (uint)DAT_01b89df0;
              local_5c8._0_4_ = A;
              local_5c8._4_4_ = SNORM_INT8;
              TStack_5c0.order = A;
              TStack_5c0.type = SNORM_INT8;
              local_5b8 = (qpTestLog *)0x1;
              TStack_5b0.order = 1;
              TStack_5b0.type = 0;
              local_4a8._4_4_ = (int)local_5e8.m_data[1] + -1;
              local_4a8._0_4_ = (int)local_5e8.m_data[0] + -1;
              local_4a8._8_4_ = (int)local_5e8.m_data[2] + -1;
              local_4a8._12_4_ = (int)local_5e8.m_data[3] + -1;
              local_598.m_data = (int  [4])ZEXT816(0);
              local_588 = ZEXT816(0);
              lVar49 = 0;
              do {
                lVar38 = *(long *)(local_4a8 + lVar49 * 4);
                auVar72._8_4_ = (int)((ulong)lVar38 >> 0x20);
                auVar72._0_8_ = lVar38;
                auVar72._12_4_ = -(uint)(lVar38 < 0);
                *(ulong *)(local_598.m_data + lVar49 * 2) =
                     CONCAT44(-(uint)((int)lVar38 < 0),(int)lVar38);
                *(long *)(local_598.m_data + lVar49 * 2 + 2) = auVar72._8_8_;
                lVar49 = lVar49 + 2;
              } while (lVar49 != 4);
              local_1b8 = (undefined1  [16])0x0;
              local_1c8 = (undefined1  [16])0x0;
              lVar49 = 0;
              do {
                TVar30 = (&TStack_5c0)[lVar49];
                auVar79 = *(undefined1 (*) [16])(local_598.m_data + lVar49 * 2);
                auVar86._8_4_ = auVar79._8_4_;
                auVar86._12_4_ = auVar79._12_4_;
                auVar86._0_8_ = auVar79._8_8_;
                *(long *)(local_1c8 + lVar49 * 8) =
                     *(long *)(local_5c8 + lVar49 * 8) << auVar79._0_8_;
                *(long *)(local_1c8 + lVar49 * 8 + 8) = (long)TVar30 << auVar86._8_8_;
                lVar49 = lVar49 + 2;
              } while (lVar49 != 4);
              local_388.m_data = (float  [4])ZEXT816(0);
              _local_398 = (float  [4])ZEXT816(0);
              lVar49 = 0;
              do {
                lVar38 = *(long *)(local_1c8 + lVar49 * 8 + 8);
                *(long *)(local_398 + lVar49 * 8) = -*(long *)(local_1c8 + lVar49 * 8);
                *(long *)(local_398 + lVar49 * 8 + 8) = -lVar38;
                lVar49 = lVar49 + 2;
              } while (lVar49 != 4);
              local_438 = (ulong *)(0L << auVar79._0_8_);
              uStack_430 = 0;
              lVar49 = 0;
              do {
                *(ulong *)((long)&local_438 + lVar49 * 4) =
                     CONCAT44(*(undefined4 *)(local_398 + lVar49 * 8 + 8),
                              *(undefined4 *)(local_398 + lVar49 * 8));
                lVar49 = lVar49 + 2;
              } while (lVar49 != 4);
              local_5c8._0_4_ = A;
              local_5c8._4_4_ = SNORM_INT8;
              TStack_5c0.order = A;
              TStack_5c0.type = SNORM_INT8;
              local_5b8 = (qpTestLog *)0x1;
              TStack_5b0.order = A;
              TStack_5b0.type = SNORM_INT8;
              local_1e8 = (float)((int)local_5e8.m_data[0] + -1);
              iStack_1e4 = (int)local_5e8.m_data[1] + -1;
              iStack_1e0 = (int)local_5e8.m_data[2] + -1;
              iStack_1dc = (int)local_5e8.m_data[3] + -1;
              local_598.m_data[0] = 0;
              local_598.m_data[1] = 0;
              local_598.m_data[2] = 0;
              local_598.m_data[3] = 0;
              local_588 = (undefined1  [16])0x0;
              lVar49 = 0;
              do {
                lVar38 = *(long *)(&local_1e8 + lVar49);
                auVar73._8_4_ = (int)((ulong)lVar38 >> 0x20);
                auVar73._0_8_ = lVar38;
                auVar73._12_4_ = -(uint)(lVar38 < 0);
                *(ulong *)(local_598.m_data + lVar49 * 2) =
                     CONCAT44(-(uint)((int)lVar38 < 0),(int)lVar38);
                *(long *)(local_598.m_data + lVar49 * 2 + 2) = auVar73._8_8_;
                lVar49 = lVar49 + 2;
              } while (lVar49 != 4);
              local_1b8 = (undefined1  [16])0x0;
              local_1c8 = (undefined1  [16])0x0;
              lVar49 = 0;
              do {
                TVar30 = (&TStack_5c0)[lVar49];
                auVar79 = *(undefined1 (*) [16])(local_598.m_data + lVar49 * 2);
                auVar87._8_4_ = auVar79._8_4_;
                auVar87._12_4_ = auVar79._12_4_;
                auVar87._0_8_ = auVar79._8_8_;
                *(long *)(local_1c8 + lVar49 * 8) =
                     *(long *)(local_5c8 + lVar49 * 8) << auVar79._0_8_;
                *(long *)(local_1c8 + lVar49 * 8 + 8) = (long)TVar30 << auVar87._8_8_;
                lVar49 = lVar49 + 2;
              } while (lVar49 != 4);
              local_388.m_data = (float  [4])ZEXT816(0);
              _local_398 = (float  [4])ZEXT816(0);
              lVar49 = 0;
              auVar88._8_4_ = 0xffffffff;
              auVar88._0_8_ = 0xffffffffffffffff;
              auVar88._12_4_ = 0xffffffff;
              do {
                lVar38 = *(long *)(local_1c8 + lVar49 * 8 + 8);
                *(long *)(local_398 + lVar49 * 8) = *(long *)(local_1c8 + lVar49 * 8) + -1;
                *(long *)(local_398 + lVar49 * 8 + 8) = lVar38 + auVar88._8_8_;
                lVar49 = lVar49 + 2;
              } while (lVar49 != 4);
              local_4a8 = (undefined1  [16])0x0;
              lVar49 = 0;
              do {
                *(ulong *)(local_4a8 + lVar49 * 4) =
                     CONCAT44(*(undefined4 *)(local_398 + lVar49 * 8 + 8),
                              *(undefined4 *)(local_398 + lVar49 * 8));
                lVar49 = lVar49 + 2;
              } while (lVar49 != 4);
              local_1c8._4_4_ =
                   ~-(uint)((int)local_438._4_4_ < (int)local_578.m_data[1]) & local_438._4_4_ |
                   (uint)local_578.m_data[1] &
                   -(uint)((int)local_438._4_4_ < (int)local_578.m_data[1]);
              local_1c8._0_4_ =
                   ~-(uint)((int)(ChannelOrder)local_438 < (int)local_578.m_data[0]) &
                   (ChannelOrder)local_438 |
                   (uint)local_578.m_data[0] &
                   -(uint)((int)(ChannelOrder)local_438 < (int)local_578.m_data[0]);
              local_1c8._8_4_ =
                   ~-(uint)((int)(uint)uStack_430 < (int)local_578.m_data[2]) & (uint)uStack_430 |
                   (uint)local_578.m_data[2] &
                   -(uint)((int)(uint)uStack_430 < (int)local_578.m_data[2]);
              local_1c8._12_4_ =
                   ~-(uint)((int)uStack_430._4_4_ < (int)local_578.m_data[3]) & uStack_430._4_4_ |
                   (uint)local_578.m_data[3] &
                   -(uint)((int)uStack_430._4_4_ < (int)local_578.m_data[3]);
              local_398._0_4_ = 0.0;
              local_398._4_4_ = 0.0;
              uStack_390._0_4_ = 0.0;
              uStack_390._4_4_ = 0.0;
              poVar33 = (ostringstream *)&local_578;
              lVar49 = 0;
              poVar43 = (ostringstream *)local_1c8;
              do {
                poVar53 = poVar43;
                if (*(char *)((long)&local_544 + lVar49) != '\0') {
                  poVar53 = poVar33;
                }
                *(undefined4 *)(local_398 + lVar49 * 4) = *(undefined4 *)poVar53;
                lVar49 = lVar49 + 1;
                poVar43 = poVar43 + 4;
                poVar33 = poVar33 + 4;
              } while (lVar49 != 4);
              local_578.m_data[0] = (float)local_398._0_4_;
              local_578.m_data[1] = (float)local_398._4_4_;
              local_578.m_data[2] = (float)uStack_390;
              local_578.m_data[3] = uStack_390._4_4_;
              local_1c8._4_4_ =
                   ~-(uint)((int)local_418._4_4_ < (int)local_4a8._4_4_) & local_4a8._4_4_ |
                   local_418._4_4_ & -(uint)((int)local_418._4_4_ < (int)local_4a8._4_4_);
              local_1c8._0_4_ =
                   ~-(uint)((int)local_418._0_4_ < (int)local_4a8._0_4_) & local_4a8._0_4_ |
                   local_418._0_4_ & -(uint)((int)local_418._0_4_ < (int)local_4a8._0_4_);
              local_1c8._8_4_ =
                   ~-(uint)((int)local_418._8_4_ < (int)local_4a8._8_4_) & local_4a8._8_4_ |
                   local_418._8_4_ & -(uint)((int)local_418._8_4_ < (int)local_4a8._8_4_);
              local_1c8._12_4_ =
                   ~-(uint)((int)fStack_40c < (int)local_4a8._12_4_) & local_4a8._12_4_ |
                   (uint)fStack_40c & -(uint)((int)fStack_40c < (int)local_4a8._12_4_);
              local_398._0_4_ = 0.0;
              local_398._4_4_ = 0.0;
              uStack_390._0_4_ = 0.0;
              uStack_390._4_4_ = 0.0;
              poVar33 = (ostringstream *)local_418;
              lVar49 = 0;
              poVar43 = (ostringstream *)local_1c8;
              do {
                poVar53 = poVar43;
                if (*(char *)((long)&local_544 + lVar49) != '\0') {
                  poVar53 = poVar33;
                }
                *(undefined4 *)(local_398 + lVar49 * 4) = *(undefined4 *)poVar53;
                pp_Var19 = uStack_390;
                lVar49 = lVar49 + 1;
                poVar43 = poVar43 + 4;
                poVar33 = poVar33 + 4;
              } while (lVar49 != 4);
              local_418._0_4_ = local_398._0_4_;
              local_418._4_4_ = local_398._4_4_;
              local_418._8_4_ = (float)uStack_390;
              fStack_40c = uStack_390._4_4_;
              uStack_390 = pp_Var19;
            }
            local_398 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"out",3);
            std::ostream::operator<<(poVar3,(int)uVar42);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3," value range: ",0xe);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"(",1);
            lVar49 = 0;
            do {
              if (lVar49 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,", ",2);
              }
              if (lVar49 < local_480) {
                poVar32 = (ostream *)
                          std::ostream::operator<<
                                    ((ostringstream *)local_1c8,(int)local_578.m_data[lVar49]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar32," -> ",4);
                std::ostream::operator<<(poVar32,*(int *)(local_418 + lVar49 * 4));
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Undef",5);
              }
              lVar49 = lVar49 + 1;
            } while (lVar49 != 4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,")",1);
            uVar42 = local_540;
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
            std::ios_base::~ios_base(local_158);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3,(char *)local_5c8,(long)TStack_5c0);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if (local_5c8 != (undefined1  [8])&local_5b8) {
              operator_delete((void *)local_5c8,(ulong)((long)&local_5b8->flags + 1));
            }
            std::__cxx11::ostringstream::~ostringstream(poVar3);
            std::ios_base::~ios_base(local_320);
            local_398._4_4_ = iStack_44;
            local_398._0_4_ = local_48;
            uStack_390._4_4_ = (float)iStack_3c;
            uStack_390._0_4_ = (float)iStack_40;
            uVar25 = (uint)uVar42;
            uVar67 = uVar25 + 7;
            if (-1 < (int)uVar25) {
              uVar67 = uVar25;
            }
            lVar49 = (long)(int)(uVar25 - (uVar67 & 0xfffffff8)) * 0x10;
            iVar21 = *(int *)(s_swizzles + lVar49);
            local_4e8 = (pointer)(long)*(int *)(s_swizzles + lVar49 + 4);
            local_4b8 = (long)*(int *)(s_swizzles + lVar49 + 8);
            local_448 = (TextureFormat)(long)*(int *)(s_swizzles + lVar49 + 0xc);
            local_438 = (ulong *)CONCAT44(*(undefined4 *)
                                           (local_398 + (long)*(int *)(s_swizzles + lVar49 + 4) * 4)
                                          ,*(undefined4 *)(local_398 + (long)iVar21 * 4));
            uStack_430 = CONCAT44(*(undefined4 *)
                                   (local_398 + (long)*(int *)(s_swizzles + lVar49 + 0xc) * 4),
                                  *(undefined4 *)
                                   (local_398 + (long)*(int *)(s_swizzles + lVar49 + 8) * 4));
            local_5b8 = (qpTestLog *)0x0;
            TStack_5b0.order = R;
            TStack_5b0.type = SNORM_INT8;
            local_5c8._0_4_ = R;
            local_5c8._4_4_ = SNORM_INT8;
            TStack_5c0.order = R;
            TStack_5c0.type = SNORM_INT8;
            lVar49 = 0;
            do {
              lVar38 = *(long *)(local_418 + lVar49 * 4);
              auVar74._8_4_ = (int)((ulong)lVar38 >> 0x20);
              auVar74._0_8_ = lVar38;
              auVar74._12_4_ = -(uint)(lVar38 < 0);
              *(ulong *)(local_5c8 + lVar49 * 8) = CONCAT44(-(uint)((int)lVar38 < 0),(int)lVar38);
              (&TStack_5c0)[lVar49] = auVar74._8_8_;
              lVar49 = lVar49 + 2;
            } while (lVar49 != 4);
            local_588 = (undefined1  [16])0x0;
            local_598.m_data[0] = 0;
            local_598.m_data[1] = 0;
            local_598.m_data[2] = 0;
            local_598.m_data[3] = 0;
            lVar49 = 0;
            do {
              lVar38 = *(long *)(local_578.m_data + lVar49);
              auVar75._8_4_ = (int)((ulong)lVar38 >> 0x20);
              auVar75._0_8_ = lVar38;
              auVar75._12_4_ = -(uint)(lVar38 < 0);
              *(ulong *)(local_598.m_data + lVar49 * 2) =
                   CONCAT44(-(uint)((int)lVar38 < 0),(int)lVar38);
              *(long *)(local_598.m_data + lVar49 * 2 + 2) = auVar75._8_8_;
              VVar17.m_data = local_578.m_data;
              lVar49 = lVar49 + 2;
            } while (lVar49 != 4);
            local_1b8 = (undefined1  [16])0x0;
            local_1c8 = (undefined1  [16])0x0;
            lVar49 = 0;
            do {
              TVar30 = (&TStack_5c0)[lVar49];
              lVar38 = *(long *)(local_598.m_data + lVar49 * 2 + 2);
              *(long *)(local_1c8 + lVar49 * 8) =
                   *(long *)(local_5c8 + lVar49 * 8) - *(long *)(local_598.m_data + lVar49 * 2);
              *(long *)(local_1c8 + lVar49 * 8 + 8) = (long)TVar30 - lVar38;
              lVar49 = lVar49 + 2;
            } while (lVar49 != 4);
            local_5d8 = (undefined1  [16])0x0;
            local_5e8.m_data[0] = 0.0;
            local_5e8.m_data[1] = 0.0;
            local_5e8.m_data[2] = 0.0;
            local_5e8.m_data[3] = 0.0;
            lVar49 = 0;
            do {
              lVar38 = *(long *)((long)&local_438 + lVar49 * 4);
              auVar76._8_4_ = (int)((ulong)lVar38 >> 0x20);
              auVar76._0_8_ = lVar38;
              auVar76._12_4_ = -(uint)(lVar38 < 0);
              *(ulong *)(local_5e8.m_data + lVar49 * 2) =
                   CONCAT44(-(uint)((int)lVar38 < 0),(int)lVar38);
              *(long *)(local_5e8.m_data + lVar49 * 2 + 2) = auVar76._8_8_;
              lVar49 = lVar49 + 2;
            } while (lVar49 != 4);
            local_388.m_data[0] = 0.0;
            local_388.m_data[1] = 0.0;
            local_388.m_data[2] = 0.0;
            local_388.m_data[3] = 0.0;
            local_398._0_4_ = 0.0;
            local_398._4_4_ = 0.0;
            uStack_390._0_4_ = 0.0;
            uStack_390._4_4_ = 0.0;
            lVar49 = 0;
            do {
              *(long *)(local_398 + lVar49 * 8) =
                   *(long *)(local_1c8 + lVar49 * 8) / *(long *)(local_5e8.m_data + lVar49 * 2);
              lVar49 = lVar49 + 1;
            } while (lVar49 != 4);
            local_4a8 = (undefined1  [16])0x0;
            lVar49 = 0;
            do {
              *(ulong *)(local_4a8 + lVar49 * 4) =
                   CONCAT44(*(undefined4 *)(local_398 + lVar49 * 8 + 8),
                            *(undefined4 *)(local_398 + lVar49 * 8));
              lVar49 = lVar49 + 2;
            } while (lVar49 != 4);
            puVar8 = (&((local_3c8.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start)[(long)local_4c8];
            local_4c8 = (TestLog *)local_4a8._0_8_;
            uStack_4c0 = (_func_int **)local_4a8._8_8_;
            iVar24 = 0;
            local_458._0_4_ = (int)local_578.m_data[0];
            local_458._4_4_ = (int)local_578.m_data[1];
            fStack_450 = local_578.m_data[2];
            fStack_44c = local_578.m_data[3];
            CVar63 = SNORM_INT8;
            local_578.m_data = VVar17.m_data;
            do {
              local_3e8 = (pointer)CONCAT44(local_3e8._4_4_,iVar24);
              uVar51 = local_530 & 0xffffffff;
              uVar66 = 0;
              uVar42 = local_550;
              do {
                local_1c8._4_4_ = CVar63;
                local_1c8._0_4_ = (ChannelOrder)uVar66;
                local_1c8._8_4_ = (int)uVar51;
                local_1c8._12_4_ = (int)uVar48 - CVar63;
                auVar96._4_4_ = local_4c8._4_4_;
                auVar96._0_4_ = local_4c8._4_4_;
                auVar96._8_4_ = uStack_4c0._4_4_;
                auVar96._12_4_ = uStack_4c0._4_4_;
                local_398._4_4_ =
                     local_4c8._4_4_ * *(int *)(local_1c8 + (long)local_4e8 * 4) + local_458._4_4_;
                local_398._0_4_ =
                     *(int *)(local_1c8 + (long)iVar21 * 4) * (int)(float)local_4c8 + (int)local_458
                ;
                uStack_390._0_4_ =
                     (float)((int)((ulong)*(uint *)(local_1c8 + local_4b8 * 4) *
                                  ((ulong)uStack_4c0 & 0xffffffff)) + (int)fStack_450);
                uStack_390._4_4_ =
                     (float)((int)((auVar96._8_8_ & 0xffffffff) *
                                  (ulong)*(uint *)(local_1c8 + (long)local_448 * 4)) +
                            (int)fStack_44c);
                if (0 < (int)uVar50) {
                  memcpy(puVar8 + iVar24,local_398,local_518._0_8_);
                  uVar42 = local_550;
                }
                uVar66 = uVar66 + 1;
                uVar51 = (ulong)((int)uVar51 - 1);
                iVar24 = iVar24 + uVar50;
              } while (uVar42 != uVar66);
              iVar24 = (int)local_3e8 + (uint)local_4f8;
              bVar20 = (ChannelType)local_520 != CVar63;
              uVar48 = local_520;
              CVar63 = CVar63 + SNORM_INT16;
            } while (bVar20);
            goto LAB_012b9658;
          }
          if ((uint)local_1d0 < 4) {
            if (getUintRange(glu::Precision)::ranges == '\0') {
              iterate();
            }
            uVar42 = local_540;
            local_5e8.m_data[1] = *(float *)(getUintRange(glu::Precision)::ranges + uVar51 * 8 + 4);
            local_5e8.m_data[0] = local_5e8.m_data[1];
            local_5e8.m_data[2] = local_5e8.m_data[1];
            local_5e8.m_data[3] = local_5e8.m_data[1];
            uVar25 = pFVar29->location + iVar21;
            poVar3 = (ostringstream *)(local_398 + 8);
            if ((-1 < (int)uVar25) &&
               ((int)uVar25 <
                (int)((ulong)((long)local_478.
                                    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_478.
                                   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333))
            {
              tcu::getTextureFormatBitDepth
                        ((tcu *)&local_578,
                         &local_478.
                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar25].format);
              local_5c8._0_4_ = A;
              local_5c8._4_4_ = SNORM_INT8;
              TStack_5c0.order = A;
              TStack_5c0.type = SNORM_INT8;
              local_5b8 = (qpTestLog *)0x1;
              TStack_5b0.order = A;
              TStack_5b0.type = SNORM_INT8;
              local_588 = ZEXT816(0);
              local_598.m_data = (int  [4])ZEXT816(0);
              lVar49 = 0;
              do {
                lVar38 = *(long *)(local_578.m_data + lVar49);
                auVar77._8_4_ = (int)((ulong)lVar38 >> 0x20);
                auVar77._0_8_ = lVar38;
                auVar77._12_4_ = -(uint)(lVar38 < 0);
                *(ulong *)(local_598.m_data + lVar49 * 2) =
                     CONCAT44(-(uint)((int)lVar38 < 0),(int)lVar38);
                *(long *)(local_598.m_data + lVar49 * 2 + 2) = auVar77._8_8_;
                lVar49 = lVar49 + 2;
              } while (lVar49 != 4);
              local_1b8 = (undefined1  [16])0x0;
              local_1c8 = (undefined1  [16])0x0;
              lVar49 = 0;
              do {
                TVar30 = (&TStack_5c0)[lVar49];
                auVar79 = *(undefined1 (*) [16])(local_598.m_data + lVar49 * 2);
                auVar89._8_4_ = auVar79._8_4_;
                auVar89._12_4_ = auVar79._12_4_;
                auVar89._0_8_ = auVar79._8_8_;
                *(long *)(local_1c8 + lVar49 * 8) =
                     *(long *)(local_5c8 + lVar49 * 8) << auVar79._0_8_;
                *(long *)(local_1c8 + lVar49 * 8 + 8) = (long)TVar30 << auVar89._8_8_;
                lVar49 = lVar49 + 2;
              } while (lVar49 != 4);
              local_388.m_data = (float  [4])ZEXT816(0);
              _local_398 = (float  [4])ZEXT816(0);
              lVar49 = 0;
              auVar90._8_4_ = 0xffffffff;
              auVar90._0_8_ = 0xffffffffffffffff;
              auVar90._12_4_ = 0xffffffff;
              do {
                lVar38 = *(long *)(local_1c8 + lVar49 * 8 + 8);
                *(long *)(local_398 + lVar49 * 8) = *(long *)(local_1c8 + lVar49 * 8) + -1;
                *(long *)(local_398 + lVar49 * 8 + 8) = lVar38 + auVar90._8_8_;
                lVar49 = lVar49 + 2;
              } while (lVar49 != 4);
              local_418._0_4_ = 0.0;
              local_418._4_4_ = 0.0;
              local_418._8_4_ = 0.0;
              fStack_40c = 0.0;
              lVar49 = 0;
              do {
                *(ulong *)(local_418 + lVar49 * 4) =
                     CONCAT44(*(undefined4 *)(local_398 + lVar49 * 8 + 8),
                              *(undefined4 *)(local_398 + lVar49 * 8));
                lVar49 = lVar49 + 2;
              } while (lVar49 != 4);
              local_5e8.m_data[1] =
                   (float)(~-(uint)((int)-local_5e8.m_data[1] < (int)-(float)local_418._4_4_) &
                           local_418._4_4_ |
                          (uint)local_5e8.m_data[1] &
                          -(uint)((int)-local_5e8.m_data[1] < (int)-(float)local_418._4_4_));
              local_5e8.m_data[0] =
                   (float)(~-(uint)((int)-local_5e8.m_data[0] < (int)-(float)local_418._0_4_) &
                           local_418._0_4_ |
                          (uint)local_5e8.m_data[0] &
                          -(uint)((int)-local_5e8.m_data[0] < (int)-(float)local_418._0_4_));
              local_5e8.m_data[2] =
                   (float)(~-(uint)((int)-local_5e8.m_data[2] < (int)-(float)local_418._8_4_) &
                           local_418._8_4_ |
                          (uint)local_5e8.m_data[2] &
                          -(uint)((int)-local_5e8.m_data[2] < (int)-(float)local_418._8_4_));
              local_5e8.m_data[3] =
                   (float)(~-(uint)((int)-local_5e8.m_data[3] < (int)-fStack_40c) & (uint)fStack_40c
                          | (uint)local_5e8.m_data[3] &
                            -(uint)((int)-local_5e8.m_data[3] < (int)-fStack_40c));
            }
            local_398 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"out",3);
            std::ostream::operator<<(poVar3,(int)uVar42);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3," value range: ",0xe);
            local_598.m_data[0] = 0;
            local_598.m_data[1] = 0;
            local_598.m_data[2] = 0;
            local_598.m_data[3] = 0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"(",1);
            lVar49 = 0;
            do {
              if (lVar49 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,", ",2);
              }
              if (lVar49 < local_480) {
                poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar32," -> ",4);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar32);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Undef",5);
              }
              lVar49 = lVar49 + 1;
            } while (lVar49 != 4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,")",1);
            uVar42 = local_540;
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
            std::ios_base::~ios_base(local_158);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3,(char *)local_5c8,(long)TStack_5c0);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if (local_5c8 != (undefined1  [8])&local_5b8) {
              operator_delete((void *)local_5c8,(ulong)((long)&local_5b8->flags + 1));
            }
            std::__cxx11::ostringstream::~ostringstream(poVar3);
            std::ios_base::~ios_base(local_320);
            uVar25 = (uint)uVar42;
            uVar67 = uVar25 + 7;
            if (-1 < (int)uVar25) {
              uVar67 = uVar25;
            }
            local_398._4_4_ = iStack_44;
            local_398._0_4_ = local_48;
            uStack_390._4_4_ = (float)iStack_3c;
            uStack_390._0_4_ = (float)iStack_40;
            lVar49 = (long)(int)(uVar25 - (uVar67 & 0xfffffff8)) * 0x10;
            iVar21 = *(int *)(s_swizzles + lVar49);
            iVar24 = *(int *)(s_swizzles + lVar49 + 0xc);
            local_4e8 = (pointer)(long)*(int *)(s_swizzles + lVar49 + 4);
            local_4b8 = (long)*(int *)(s_swizzles + lVar49 + 8);
            local_1c8._4_4_ =
                 *(ChannelType *)(local_398 + (long)*(int *)(s_swizzles + lVar49 + 4) * 4);
            local_1c8._0_4_ = *(ChannelOrder *)(local_398 + (long)iVar21 * 4);
            local_1c8._8_4_ =
                 *(undefined4 *)(local_398 + (long)*(int *)(s_swizzles + lVar49 + 8) * 4);
            local_1c8._12_4_ = *(undefined4 *)(local_398 + (long)iVar24 * 4);
            local_398._0_4_ = 0.0;
            local_398._4_4_ = 0.0;
            uStack_390._0_4_ = 0.0;
            uStack_390._4_4_ = 0.0;
            lVar49 = 0;
            do {
              *(uint *)(local_398 + lVar49 * 4) =
                   (uint)local_5e8.m_data[lVar49] / *(uint *)(local_1c8 + lVar49 * 4);
              VVar17.m_data = _local_398;
              lVar49 = lVar49 + 1;
            } while (lVar49 != 4);
            local_4c8 = (TestLog *)
                        (&((local_3c8.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start)[(long)local_4c8];
            iVar65 = 0;
            local_448.order = local_398._0_4_;
            local_448.type = local_398._4_4_;
            pp_Stack_440 = uStack_390;
            CVar63 = SNORM_INT8;
            _local_398 = VVar17.m_data;
            do {
              local_458 = CONCAT44(local_458._4_4_,iVar65);
              uVar51 = local_530 & 0xffffffff;
              uVar66 = 0;
              uVar42 = local_550;
              do {
                local_5c8._0_4_ = (ChannelOrder)uVar66;
                local_5c8._4_4_ = CVar63;
                TStack_5c0.type = (int)uVar48 - CVar63;
                TStack_5c0.order = (ChannelOrder)uVar51;
                auVar97._4_4_ = local_448.type;
                auVar97._0_4_ = local_448.type;
                auVar97._8_4_ = pp_Stack_440._4_4_;
                auVar97._12_4_ = pp_Stack_440._4_4_;
                local_1c8._4_4_ = local_448.type * *(int *)(local_5c8 + (long)local_4e8 * 4);
                local_1c8._0_4_ = *(int *)(local_5c8 + (long)iVar21 * 4) * local_448.order;
                local_1c8._8_4_ =
                     (int)((ulong)*(uint *)(local_5c8 + local_4b8 * 4) *
                          ((ulong)pp_Stack_440 & 0xffffffff));
                local_1c8._12_4_ =
                     (int)((auVar97._8_8_ & 0xffffffff) *
                          (ulong)*(uint *)(local_5c8 + (long)iVar24 * 4));
                if (0 < (int)uVar50) {
                  memcpy((pointer)((long)&local_4c8->m_log + (long)iVar65 * 4),local_1c8,
                         local_518._0_8_);
                  uVar42 = local_550;
                }
                uVar66 = uVar66 + 1;
                uVar51 = (ulong)((ChannelOrder)uVar51 - A);
                iVar65 = iVar65 + uVar50;
              } while (uVar42 != uVar66);
              iVar65 = (int)local_458 + (uint)local_4f8;
              bVar20 = (ChannelType)local_520 != CVar63;
              uVar48 = local_520;
              CVar63 = CVar63 + SNORM_INT16;
            } while (bVar20);
            goto LAB_012b9658;
          }
        }
        uVar42 = (ulong)((int)local_540 + 1);
        iVar21 = (int)local_500 + 1;
        local_500 = (pointer)CONCAT44(local_500._4_4_,iVar21);
      } while (iVar21 != local_3d8);
      lVar49 = local_1d8 + 1;
      pFVar29 = (this->m_outputs).
                super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_540 = uVar42;
    } while (lVar49 < (int)((ulong)((long)(this->m_outputs).
                                          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar29
                                   ) >> 4));
  }
  lVar49 = local_538;
  (**(code **)(local_538 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar49 + 0x78))(0x8d40,this->m_framebuffer);
  (**(code **)(lVar49 + 0x1a00))(0,0,local_4ec,local_4f0);
  (**(code **)(lVar49 + 0x560))
            ((ulong)((long)local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  (**(code **)(lVar49 + 0x4e8))(0xbd0);
  dVar26 = (**(code **)(lVar49 + 0x800))();
  glu::checkError(dVar26,"After program setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                  ,0x303);
  pFVar29 = (this->m_outputs).
            super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_outputs).
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar29) >> 4)) {
    lVar49 = 0;
    local_4e8 = (pointer)0x0;
    do {
      local_518._0_8_ = lVar49;
      DVar4 = pFVar29[lVar49].type;
      iVar21 = pFVar29[lVar49].arrayLength;
      iVar24 = glu::getDataTypeScalarSize(DVar4);
      local_4b8 = CONCAT44(local_4b8._4_4_,iVar24);
      CVar46 = R;
      if (DVar4 - TYPE_UINT < 4) {
        CVar46 = 0x1405;
      }
      if (DVar4 - TYPE_INT < 4) {
        CVar46 = 0x1404;
      }
      local_448.order = CVar46;
      iVar24 = 1;
      if (0 < iVar21) {
        iVar24 = pFVar29[lVar49].arrayLength;
      }
      if (0 < iVar24) {
        iVar65 = 0;
        do {
          local_598.m_data._0_8_ = local_588;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"in","");
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
          std::ostream::operator<<((MessageBuilder *)local_398,local_518._0_4_);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
          std::ios_base::~ios_base(local_328);
          uVar48 = 0xf;
          if ((undefined1 *)local_598.m_data._0_8_ != local_588) {
            uVar48 = local_588._0_8_;
          }
          if (uVar48 < (ulong)(local_5e8.m_data._8_8_ + local_598.m_data._8_8_)) {
            uVar48 = 0xf;
            if ((undefined1 *)local_5e8.m_data._0_8_ != local_5d8) {
              uVar48 = local_5d8._0_8_;
            }
            if (uVar48 < (ulong)(local_5e8.m_data._8_8_ + local_598.m_data._8_8_))
            goto LAB_012b990c;
            pTVar34 = (TextureFormat *)
                      std::__cxx11::string::replace
                                ((ulong)&local_5e8,0,(char *)0x0,local_598.m_data._0_8_);
          }
          else {
LAB_012b990c:
            pTVar34 = (TextureFormat *)
                      std::__cxx11::string::_M_append((char *)&local_598,local_5e8.m_data._0_8_);
          }
          TVar30 = (TextureFormat)(pTVar34 + 2);
          if (*pTVar34 == TVar30) {
            local_5b8 = *(qpTestLog **)TVar30;
            TStack_5b0 = pTVar34[3];
            local_5c8 = (undefined1  [8])&local_5b8;
          }
          else {
            local_5b8 = *(qpTestLog **)TVar30;
            local_5c8 = (undefined1  [8])*pTVar34;
          }
          TStack_5c0 = pTVar34[1];
          *pTVar34 = TVar30;
          pTVar34[1].order = R;
          pTVar34[1].type = SNORM_INT8;
          *(undefined1 *)TVar30 = 0;
          if (iVar21 < 1) {
            ppqVar54 = &local_568;
            local_578.m_data[2] = 0.0;
            local_578.m_data[3] = 0.0;
            local_578.m_data._0_8_ = ppqVar54;
            local_568 = (qpTestLog *)((ulong)local_568 & 0xffffffffffffff00);
            lVar49 = 0;
          }
          else {
            local_418._0_8_ = local_408;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"_","");
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
            std::ostream::operator<<((MessageBuilder *)local_398,iVar65);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
            std::ios_base::~ios_base(local_328);
            uVar48 = 0xf;
            if ((ulong *)local_418._0_8_ != local_408) {
              uVar48 = local_408[0];
            }
            if (uVar48 < (ulong)(uStack_430 + stack0xfffffffffffffbf0)) {
              uVar48 = 0xf;
              if (local_438 != local_428) {
                uVar48 = local_428[0];
              }
              if (uVar48 < (ulong)(uStack_430 + stack0xfffffffffffffbf0)) goto LAB_012b9a39;
              puVar35 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_438,0,(char *)0x0,local_418._0_8_);
            }
            else {
LAB_012b9a39:
              puVar35 = (undefined8 *)std::__cxx11::string::_M_append(local_418,(ulong)local_438);
            }
            ppqVar54 = &local_568;
            ppqVar1 = (qpTestLog **)(puVar35 + 2);
            if ((qpTestLog **)*puVar35 == ppqVar1) {
              local_568 = *ppqVar1;
              uStack_560 = puVar35[3];
            }
            else {
              local_568 = *ppqVar1;
              ppqVar54 = (qpTestLog **)*puVar35;
            }
            lVar49 = puVar35[1];
            local_578.m_data[2] = (float)(int)lVar49;
            local_578.m_data[3] = (float)(int)((ulong)lVar49 >> 0x20);
            local_578.m_data._0_8_ = ppqVar54;
            *puVar35 = ppqVar1;
            puVar35[1] = 0;
            *(undefined1 *)ppqVar1 = 0;
          }
          pqVar58 = (qpTestLog *)0xf;
          if (local_5c8 != (undefined1  [8])&local_5b8) {
            pqVar58 = local_5b8;
          }
          if (pqVar58 < (qpTestLog *)(lVar49 + (long)TStack_5c0)) {
            pqVar58 = (qpTestLog *)0xf;
            if (ppqVar54 != &local_568) {
              pqVar58 = local_568;
            }
            if (pqVar58 < (qpTestLog *)(lVar49 + (long)TStack_5c0)) goto LAB_012b9b29;
            plVar36 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_578,0,(char *)0x0,(ulong)local_5c8);
          }
          else {
LAB_012b9b29:
            plVar36 = (long *)std::__cxx11::string::_M_append(local_5c8,(ulong)ppqVar54);
          }
          local_1c8._0_8_ = local_1b8;
          pauVar2 = (undefined1 (*) [16])(plVar36 + 2);
          if ((undefined1 (*) [16])*plVar36 == pauVar2) {
            local_1b8 = *pauVar2;
          }
          else {
            local_1b8._0_8_ = *(long *)*pauVar2;
            local_1c8._0_8_ = (undefined1 (*) [16])*plVar36;
          }
          local_1c8._8_8_ = plVar36[1];
          *plVar36 = (long)pauVar2;
          plVar36[1] = 0;
          (*pauVar2)[0] = 0;
          if ((qpTestLog **)local_578.m_data._0_8_ != &local_568) {
            operator_delete((void *)local_578.m_data._0_8_,(ulong)((long)&local_568->flags + 1));
          }
          if (0 < iVar21) {
            if (local_438 != local_428) {
              operator_delete(local_438,local_428[0] + 1);
            }
            if ((ulong *)local_418._0_8_ != local_408) {
              operator_delete((void *)local_418._0_8_,local_408[0] + 1);
            }
          }
          if (local_5c8 != (undefined1  [8])&local_5b8) {
            operator_delete((void *)local_5c8,(ulong)((long)&local_5b8->flags + 1));
          }
          if ((undefined1 *)local_5e8.m_data._0_8_ != local_5d8) {
            operator_delete((void *)local_5e8.m_data._0_8_,local_5d8._0_8_ + 1);
          }
          if ((undefined1 *)local_598.m_data._0_8_ != local_588) {
            operator_delete((void *)local_598.m_data._0_8_,local_588._0_8_ + 1);
          }
          iVar23 = (**(code **)(local_538 + 0x780))
                             ((this->m_program->m_program).m_program,local_1c8._0_8_);
          if (iVar23 < 0) {
            local_398 = (undefined1  [8])local_488;
            poVar3 = (ostringstream *)(local_398 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3,"Warning: No location for attribute \'",0x24);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3,(char *)local_1c8._0_8_,local_1c8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\' found.",8);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_398,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar3);
            std::ios_base::~ios_base(local_320);
          }
          else {
            (**(code **)(local_538 + 0x610))(iVar23);
            if (DVar4 - TYPE_FLOAT < 4) {
              (**(code **)(local_538 + 0x19f0))(iVar23,local_4b8 & 0xffffffff,0x1406,0,0);
            }
            else {
              (**(code **)(local_538 + 0x1958))
                        (iVar23,local_4b8 & 0xffffffff,(ulong)local_448 & 0xffffffff,0,
                         local_3c8.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(int)local_4e8 + iVar65].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start);
            }
          }
          if ((undefined1 *)local_1c8._0_8_ != local_1b8) {
            operator_delete((void *)local_1c8._0_8_,local_1b8._0_8_ + 1);
          }
          iVar65 = iVar65 + 1;
        } while (iVar24 != iVar65);
        local_4e8 = (pointer)(ulong)(uint)((int)local_4e8 + iVar65);
      }
      lVar49 = local_518._0_8_ + 1;
      pFVar29 = (this->m_outputs).
                super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar49 < (int)((ulong)((long)(this->m_outputs).
                                          super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar29
                                   ) >> 4));
  }
  lVar49 = local_538;
  iVar21 = (**(code **)(local_538 + 0x780))((this->m_program->m_program).m_program);
  uVar48 = local_4d0;
  if (iVar21 < 0) {
    pTVar40 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar40,(char *)0x0,"posLoc >= 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
               ,0x32a);
    __cxa_throw(pTVar40,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar49 + 0x610))(iVar21);
  (**(code **)(lVar49 + 0x19f0))
            (iVar21,4,0x1406,0,0,
             local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar26 = (**(code **)(lVar49 + 0x800))();
  glu::checkError(dVar26,"After attribute setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                  ,0x32e);
  (**(code **)(lVar49 + 0x568))
            (4,local_3e0,0x1403,
             local_218.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar26 = (**(code **)(lVar49 + 0x800))();
  glu::checkError(dVar26,"glDrawElements",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                  ,0x331);
  if (0 < (int)uVar48) {
    local_4b8 = (ulong)((uint)local_4d0 & 0x7fffffff);
    uVar48 = 0;
    local_4e8 = local_478.
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                ._M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar18 = local_4e8;
      TVar37 = glu::getTransferFormat(local_4e8[uVar48].readFormat);
      local_518._0_4_ = TVar37.format;
      local_518._4_4_ = TVar37.dataType;
      puVar7 = pAVar18[uVar48].renderedData.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar28 = (this->m_fboSpec).
                super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar21 = pBVar28[uVar48].width;
      iVar24 = pBVar28[uVar48].height;
      uVar50 = pAVar18[uVar48].numWrittenChannels;
      iVar65 = tcu::TextureFormat::getPixelSize(&pAVar18[uVar48].readFormat);
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_398,&pAVar18[uVar48].readFormat,iVar21,iVar24,1,
                 iVar65 * iVar21 + 3U & 0xfffffffc,0,
                 pAVar18[uVar48].renderedData.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(local_538 + 0x1218))((int)uVar48 + 0x8ce0);
      (**(code **)(local_538 + 0x1220))
                (0,0,local_4ec,local_4f0,local_518._0_8_,(ulong)local_518._0_8_ >> 0x20,puVar7);
      if (0 < (int)uStack_390._4_4_) {
        iVar21 = 0;
        fVar94 = uStack_390._4_4_;
        fVar99 = (float)uStack_390;
        do {
          if (0 < (int)fVar99) {
            iVar24 = 0;
            do {
              TVar22 = tcu::getTextureChannelClass(local_398._4_4_);
              iVar65 = (int)(TextureFormat *)local_398;
              if (TVar22 < TEXTURECHANNELCLASS_FLOATING_POINT) {
                tcu::getTextureFormatBitDepth((tcu *)local_1c8,(TextureFormat *)local_398);
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_5c8,iVar65,iVar24,iVar21);
                local_598.m_data._0_12_ = ZEXT812(0);
                local_598.m_data[3] = ~(-1 << (local_1c8[0xc] & 0x1f));
                if (0 < (int)uVar50) {
                  memcpy(&local_598,local_5c8,(ulong)uVar50 * 4);
                }
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_398,&local_598,iVar24,iVar21,0);
              }
              else if (TVar22 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)local_1c8,iVar65,iVar24,iVar21);
                local_5c8._0_4_ = R;
                local_5c8._4_4_ = SNORM_INT8;
                TStack_5c0.order = R;
                TStack_5c0.type = 0x3f800000;
                if (0 < (int)uVar50) {
                  memcpy(local_5c8,local_1c8,(ulong)uVar50 * 4);
                }
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_398,(Vec4 *)local_5c8,iVar24,iVar21,0);
              }
              iVar24 = iVar24 + 1;
            } while (iVar24 < (int)(float)uStack_390);
            fVar94 = uStack_390._4_4_;
            fVar99 = (float)uStack_390;
          }
          iVar21 = iVar21 + 1;
        } while (iVar21 < (int)fVar94);
      }
      uVar48 = uVar48 + 1;
    } while (uVar48 != local_4b8);
  }
  pFVar29 = (this->m_outputs).
            super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_outputs).
                              super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar29) >> 4)) {
    local_500 = local_478.
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_530 = (ulong)((int)local_530 - 1);
    uVar48 = (ulong)((int)local_520 - 1);
    sVar64 = 0;
    local_458 = local_458 & 0xffffffff00000000;
    local_520 = uVar48;
    do {
      local_4f8 = (ulong)pFVar29[sVar64].type;
      iVar21 = pFVar29[sVar64].arrayLength;
      local_3f0 = sVar64;
      uVar50 = glu::getDataTypeScalarSize(pFVar29[sVar64].type);
      iVar24 = 1;
      if (0 < iVar21) {
        iVar24 = pFVar29[sVar64].arrayLength;
      }
      iVar21 = (int)local_458;
      if (0 < iVar24) {
        local_538 = CONCAT44(local_538._4_4_,(int)local_4f8 + -1);
        local_4f8 = (ulong)((int)local_4f8 - 0x1b);
        iVar65 = 0;
        local_540 = CONCAT44(local_540._4_4_,iVar24);
        local_3e8 = pFVar29 + sVar64;
        do {
          local_480 = CONCAT44(local_480._4_4_,iVar65);
          iVar65 = local_3e8->location + iVar65;
          local_458 = CONCAT44(local_458._4_4_,iVar21);
          puVar8 = local_3c8.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar21].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pBVar28 = (this->m_fboSpec).
                    super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_398,&local_500[iVar65].referenceFormat,
                     pBVar28[iVar65].width,pBVar28[iVar65].height,1,
                     local_500[iVar65].referenceData.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
          tcu::getSubregion((PixelBufferAccess *)local_1c8,(PixelBufferAccess *)local_398,0,0,0,
                            local_4ec,local_4f0,1);
          if ((uint)local_4f8 < 8) {
            if (0 < (int)local_1c8._12_4_) {
              fVar94 = (float)(int)local_1c8._8_4_ / local_524;
              local_518._0_4_ = (float)(int)local_1c8._12_4_ / local_528;
              iVar65 = 0;
              iVar21 = local_1c8._12_4_;
              iVar24 = local_1c8._8_4_;
              do {
                if (0 < iVar24) {
                  fVar99 = floorf((float)iVar65 / (float)local_518._0_4_);
                  iVar24 = (int)fVar99;
                  iVar21 = (int)uVar48;
                  if (iVar24 < (int)uVar48) {
                    iVar21 = iVar24;
                  }
                  iVar23 = 0;
                  if (iVar24 < 0) {
                    iVar21 = 0;
                  }
                  iVar21 = iVar21 * (int)local_550;
                  do {
                    fVar99 = floorf((float)iVar23 / fVar94);
                    iVar62 = (int)fVar99;
                    iVar24 = iVar62;
                    if ((int)local_530 <= iVar62) {
                      iVar24 = (int)local_530;
                    }
                    TStack_5c0.type = SNORM_INT8;
                    iVar47 = 0;
                    if (-1 < iVar62) {
                      iVar47 = iVar24;
                    }
                    lVar49 = (long)(int)((iVar47 + iVar21 + 1) * uVar50);
                    if ((int)uVar50 < 2) {
                      TStack_5c0.order = R;
                      local_5c8._4_4_ = SNORM_INT8;
                    }
                    else {
                      local_5c8._4_4_ = puVar8[lVar49 + 1];
                      if (uVar50 == 2) {
                        TStack_5c0.order = R;
                        TStack_5c0.type = SNORM_INT8;
                      }
                      else {
                        TStack_5c0.order = puVar8[lVar49 + 2];
                        TStack_5c0.type = SNORM_INT8;
                        if (3 < uVar50) {
                          TStack_5c0.type = puVar8[lVar49 + 3];
                        }
                      }
                    }
                    local_5c8._0_4_ = puVar8[lVar49];
                    tcu::PixelBufferAccess::setPixel
                              ((PixelBufferAccess *)local_1c8,(IVec4 *)local_5c8,iVar23,iVar65,0);
                    iVar23 = iVar23 + 1;
                  } while (iVar23 < (int)local_1c8._8_4_);
                  uVar48 = local_520;
                  iVar21 = local_1c8._12_4_;
                  iVar24 = local_1c8._8_4_;
                }
                iVar65 = iVar65 + 1;
              } while (iVar65 < iVar21);
            }
          }
          else if ((uint)local_538 < 4) {
            bVar20 = tcu::isSRGB((TextureFormat)local_1c8._0_8_);
            local_448.order._0_1_ = bVar20;
            if (0 < (int)local_1c8._12_4_) {
              fVar94 = (float)(int)local_1c8._8_4_ / local_524;
              local_4c8 = (TestLog *)
                          CONCAT44(local_4c8._4_4_,(float)(int)local_1c8._12_4_ / local_528);
              iVar65 = 0;
              iVar21 = local_1c8._12_4_;
              iVar24 = local_1c8._8_4_;
              do {
                if (0 < iVar24) {
                  fVar99 = floorf((float)iVar65 / (float)local_4c8);
                  iVar24 = (int)fVar99;
                  iVar21 = (int)uVar48;
                  if (iVar24 < (int)uVar48) {
                    iVar21 = iVar24;
                  }
                  iVar23 = 0;
                  if (iVar24 < 0) {
                    iVar21 = 0;
                  }
                  fVar99 = (((float)iVar65 - (float)iVar21 * (float)local_4c8) + 0.5) /
                           (float)local_4c8;
                  iVar24 = (int)local_550;
                  local_4e8 = (pointer)(ulong)(uint)(iVar21 * iVar24);
                  local_4b8 = CONCAT44(local_4b8._4_4_,1.0 - fVar99);
                  do {
                    local_518 = ZEXT416((uint)(float)iVar23);
                    fVar70 = floorf((float)iVar23 / fVar94);
                    iVar47 = (int)fVar70;
                    iVar62 = iVar47;
                    if ((int)local_530 <= iVar47) {
                      iVar62 = (int)local_530;
                    }
                    iVar27 = 0;
                    if (-1 < iVar47) {
                      iVar27 = iVar62;
                    }
                    iVar62 = (int)local_4e8 + iVar27;
                    lVar49 = (long)(int)(iVar62 * uVar50);
                    fVar70 = 0.0;
                    TStack_5c0.order = R;
                    local_5c8._4_4_ = SNORM_INT8;
                    TStack_5c0.type = SNORM_INT8;
                    if (((1 < (int)uVar50) && (local_5c8._4_4_ = puVar8[lVar49 + 1], uVar50 != 2))
                       && (TStack_5c0.order = puVar8[lVar49 + 2], 3 < uVar50)) {
                      TStack_5c0.type = puVar8[lVar49 + 3];
                    }
                    iVar47 = iVar27 + (iVar21 + 1) * iVar24;
                    local_5c8._0_4_ = puVar8[lVar49];
                    lVar49 = (long)(int)(iVar47 * uVar50);
                    fVar85 = (float)puVar8[lVar49];
                    if ((int)uVar50 < 2) {
                      fVar98 = 0.0;
                      fVar93 = 0.0;
                    }
                    else {
                      fVar93 = (float)puVar8[lVar49 + 1];
                      if (uVar50 == 2) {
                        fVar98 = 0.0;
                      }
                      else {
                        fVar98 = (float)puVar8[lVar49 + 2];
                        if (3 < uVar50) {
                          fVar70 = (float)puVar8[lVar49 + 3];
                        }
                      }
                    }
                    lVar49 = (long)(int)((iVar62 + 1) * uVar50);
                    local_598.m_data[3] = 0;
                    fVar105 = 0.0;
                    fVar104 = 0.0;
                    fVar106 = 0.0;
                    if (((1 < (int)uVar50) && (fVar104 = (float)puVar8[lVar49 + 1], uVar50 != 2)) &&
                       (fVar105 = (float)puVar8[lVar49 + 2], 3 < uVar50)) {
                      fVar106 = (float)puVar8[lVar49 + 3];
                    }
                    lVar38 = (long)(int)((iVar47 + 1) * uVar50);
                    if ((int)uVar50 < 2) {
                      local_598.m_data[2] = 0;
                      local_598.m_data[1] = 0;
                    }
                    else {
                      local_598.m_data[1] = puVar8[lVar38 + 1];
                      if (uVar50 == 2) {
                        local_598.m_data[2] = 0;
                      }
                      else {
                        local_598.m_data[2] = puVar8[lVar38 + 2];
                        if (3 < uVar50) {
                          local_598.m_data[3] = puVar8[lVar38 + 3];
                        }
                      }
                    }
                    fVar107 = (((float)local_518._0_4_ - (float)iVar27 * fVar94) + 0.5) / fVar94;
                    local_598.m_data[0] = puVar8[lVar38];
                    bVar20 = fVar99 + fVar107 < 1.0;
                    fVar71 = fVar85;
                    fVar82 = fVar93;
                    fVar83 = fVar98;
                    fVar84 = fVar70;
                    pIVar16 = &local_598;
                    if (bVar20) {
                      pIVar16 = (IVec4 *)local_5c8;
                      fVar71 = (float)puVar8[lVar49];
                      fVar82 = fVar104;
                      fVar83 = fVar105;
                      fVar84 = fVar106;
                    }
                    fVar12 = (float)pIVar16->m_data[0];
                    fVar13 = (float)pIVar16->m_data[1];
                    fVar14 = (float)pIVar16->m_data[2];
                    fVar15 = (float)pIVar16->m_data[3];
                    if (!bVar20) {
                      fVar107 = 1.0 - fVar107;
                      fVar85 = (float)puVar8[lVar49];
                      fVar93 = fVar104;
                      fVar98 = fVar105;
                      fVar70 = fVar106;
                    }
                    fVar104 = (float)local_4b8;
                    if (bVar20) {
                      fVar104 = fVar99;
                    }
                    fVar85 = fVar104 * (fVar85 - fVar12) + fVar107 * (fVar71 - fVar12) + fVar12;
                    fVar93 = fVar104 * (fVar93 - fVar13) + fVar107 * (fVar82 - fVar13) + fVar13;
                    afVar92 = (float  [4])
                              CONCAT412(fVar104 * (fVar70 - fVar15) +
                                        fVar107 * (fVar84 - fVar15) + fVar15,
                                        CONCAT48(fVar104 * (fVar98 - fVar14) +
                                                 fVar107 * (fVar83 - fVar14) + fVar14,
                                                 CONCAT44(fVar93,fVar85)));
                    local_5e8.m_data = afVar92;
                    if ((undefined1)local_448.order == '\0') {
                      local_5e8.m_data._8_8_ = afVar92._8_8_;
                      local_578.m_data[2] = local_5e8.m_data[2];
                      local_578.m_data[3] = local_5e8.m_data[3];
                      local_578.m_data[0] = fVar85;
                      local_578.m_data[1] = fVar93;
                    }
                    else {
                      tcu::linearToSRGB((tcu *)&local_578,&local_5e8);
                    }
                    tcu::PixelBufferAccess::setPixel
                              ((PixelBufferAccess *)local_1c8,&local_578,iVar23,iVar65,0);
                    iVar23 = iVar23 + 1;
                  } while (iVar23 < (int)local_1c8._8_4_);
                  uVar48 = local_520;
                  iVar21 = local_1c8._12_4_;
                  iVar24 = local_1c8._8_4_;
                }
                iVar65 = iVar65 + 1;
              } while (iVar65 < iVar21);
            }
          }
          iVar21 = (int)local_458 + 1;
          iVar65 = (int)local_480 + 1;
        } while (iVar65 != (int)local_540);
      }
      local_458 = CONCAT44(local_458._4_4_,iVar21);
      sVar64 = local_3f0 + 1;
      pFVar29 = (this->m_outputs).
                super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while ((long)sVar64 <
             (long)(int)((ulong)((long)(this->m_outputs).
                                       super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar29)
                        >> 4));
  }
  pAVar18 = local_478.
            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((int)(uint)local_4d0 < 1) {
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    local_4d0 = (ulong)((uint)local_4d0 & 0x7fffffff);
    bVar41 = 1;
    uVar48 = 0;
    do {
      pBVar28 = (this->m_fboSpec).
                super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar21 = pBVar28[uVar48].width;
      iVar24 = pBVar28[uVar48].height;
      iVar65 = pAVar18[uVar48].numWrittenChannels;
      local_550 = CONCAT44(local_550._4_4_,iVar65);
      auVar78._0_4_ = -(uint)(0 < iVar65);
      auVar78._4_4_ = -(uint)(1 < iVar65);
      auVar78._8_4_ = -(uint)(2 < iVar65);
      auVar78._12_4_ = -(uint)(3 < iVar65);
      auVar79 = packssdw(auVar78,auVar78);
      auVar79 = packsswb(auVar79,auVar79);
      local_544 = auVar79._0_4_ & (uint)DAT_01b89df0;
      local_518._0_4_ = pAVar18[uVar48].outPrecision;
      iVar65 = tcu::TextureFormat::getPixelSize(&pAVar18[uVar48].readFormat);
      format = pAVar18 + uVar48;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_1c8,&pAVar18[uVar48].readFormat,iVar21,iVar24,1,
                 iVar65 * iVar21 + 3U & 0xfffffffc,0,
                 (format->renderedData).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_5c8,&format->referenceFormat,iVar21,iVar24,1,
                 (format->referenceData).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      TVar22 = tcu::getTextureChannelClass((format->format).type);
      this_01 = (MessageBuilder *)local_398;
      local_5e8.m_data._0_8_ = local_5d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"Attachment","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
      iVar21 = (int)uVar48;
      std::ostream::operator<<(this_01,iVar21);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
      std::ios_base::~ios_base(local_328);
      pqVar58 = (qpTestLog *)0xf;
      if ((undefined1 *)local_5e8.m_data._0_8_ != local_5d8) {
        pqVar58 = (qpTestLog *)local_5d8._0_8_;
      }
      if (pqVar58 < (qpTestLog *)(local_578.m_data._8_8_ + local_5e8.m_data._8_8_)) {
        pqVar58 = (qpTestLog *)0xf;
        if ((qpTestLog **)local_578.m_data._0_8_ != &local_568) {
          pqVar58 = local_568;
        }
        if (pqVar58 < (qpTestLog *)(local_578.m_data._8_8_ + local_5e8.m_data._8_8_))
        goto LAB_012baa21;
        plVar36 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_578,0,(char *)0x0,local_5e8.m_data._0_8_);
      }
      else {
LAB_012baa21:
        plVar36 = (long *)std::__cxx11::string::_M_append((char *)&local_5e8,local_578.m_data._0_8_)
        ;
      }
      local_598.m_data._0_8_ = local_588;
      pauVar2 = (undefined1 (*) [16])(plVar36 + 2);
      if ((undefined1 (*) [16])*plVar36 == pauVar2) {
        local_588 = *pauVar2;
      }
      else {
        local_588._0_8_ = *(long *)*pauVar2;
        local_598.m_data._0_8_ = (undefined1 (*) [16])*plVar36;
      }
      local_598.m_data._8_8_ = plVar36[1];
      *plVar36 = (long)pauVar2;
      plVar36[1] = 0;
      (*pauVar2)[0] = 0;
      if ((qpTestLog **)local_578.m_data._0_8_ != &local_568) {
        operator_delete((void *)local_578.m_data._0_8_,(ulong)((long)&local_568->flags + 1));
      }
      if ((undefined1 *)local_5e8.m_data._0_8_ != local_5d8) {
        operator_delete((void *)local_5e8.m_data._0_8_,local_5d8._0_8_ + 1);
      }
      local_578.m_data._0_8_ = &local_568;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"Color attachment ","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
      std::ostream::operator<<(this_01,iVar21);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
      std::ios_base::~ios_base(local_328);
      pqVar58 = (qpTestLog *)0xf;
      if ((qpTestLog **)local_578.m_data._0_8_ != &local_568) {
        pqVar58 = local_568;
      }
      if (pqVar58 < (qpTestLog *)(local_4a8._8_8_ + local_578.m_data._8_8_)) {
        TVar59.m_log = (qpTestLog *)0xf;
        if ((TestLog *)local_4a8._0_8_ != local_498) {
          TVar59.m_log = local_498[0].m_log;
        }
        if (TVar59.m_log < (qpTestLog *)(local_4a8._8_8_ + local_578.m_data._8_8_))
        goto LAB_012bab90;
        plVar36 = (long *)std::__cxx11::string::replace
                                    ((ulong)local_4a8,0,(char *)0x0,local_578.m_data._0_8_);
      }
      else {
LAB_012bab90:
        plVar36 = (long *)std::__cxx11::string::_M_append((char *)&local_578,local_4a8._0_8_);
      }
      local_5e8.m_data._0_8_ = local_5d8;
      pauVar2 = (undefined1 (*) [16])(plVar36 + 2);
      if ((undefined1 (*) [16])*plVar36 == pauVar2) {
        local_5d8 = *pauVar2;
      }
      else {
        local_5d8._0_8_ = *(long *)*pauVar2;
        local_5e8.m_data._0_8_ = (undefined1 (*) [16])*plVar36;
      }
      local_5e8.m_data._8_8_ = plVar36[1];
      *plVar36 = (long)pauVar2;
      plVar36[1] = 0;
      (*pauVar2)[0] = 0;
      if ((TestLog *)local_4a8._0_8_ != local_498) {
        operator_delete((void *)local_4a8._0_8_,(ulong)((long)&(local_498[0].m_log)->flags + 1));
      }
      if ((qpTestLog **)local_578.m_data._0_8_ != &local_568) {
        operator_delete((void *)local_578.m_data._0_8_,(ulong)((long)&local_568->flags + 1));
      }
      local_398 = (undefined1  [8])local_488;
      poVar3 = (ostringstream *)(local_398 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Attachment ",0xb);
      std::ostream::operator<<(poVar3,iVar21);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,": ",2);
      std::ostream::operator<<(poVar3,(int)local_550);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3," channels have defined values and used for comparison",0x35);
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_320);
      if (TVar22 - TEXTURECHANNELCLASS_SIGNED_INTEGER < 2) {
        local_578.m_data[0] = 0.0;
        local_578.m_data[1] = 0.0;
        local_578.m_data[2] = 0.0;
        local_578.m_data[3] = 0.0;
        local_4a8._8_4_ = 0xffffffff;
        local_4a8._0_8_ = 0xffffffffffffffff;
        local_4a8._12_4_ = 0xffffffff;
        local_398._0_4_ = 0.0;
        local_398._4_4_ = 0.0;
        uStack_390._0_4_ = 0.0;
        uStack_390._4_4_ = 0.0;
        pfVar39 = local_578.m_data;
        pfVar45 = (float *)local_4a8;
        lVar49 = 0;
        do {
          pfVar56 = pfVar45;
          if (*(char *)((long)&local_544 + lVar49) != '\0') {
            pfVar56 = pfVar39;
          }
          *(float *)(local_398 + lVar49 * 4) = ((Vec4 *)pfVar56)->m_data[0];
          lVar49 = lVar49 + 1;
          pfVar45 = pfVar45 + 1;
          pfVar39 = pfVar39 + 1;
        } while (lVar49 != 4);
        bVar20 = tcu::intThresholdCompare
                           (local_488,(char *)local_598.m_data._0_8_,(char *)local_5e8.m_data._0_8_,
                            (ConstPixelBufferAccess *)local_5c8,(ConstPixelBufferAccess *)local_1c8,
                            (UVec4 *)this_01,COMPARE_LOG_RESULT);
      }
      else if (TVar22 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
        tcu::getTextureFormatBitDepth((tcu *)this_01,&format->format);
        auVar80._0_4_ =
             (int)(float)((~-(uint)((int)local_398._0_4_ < 8) & RGBA |
                          local_398._0_4_ & -(uint)((int)local_398._0_4_ < 8)) * 0x800000 +
                         (int)DAT_01a25ce0);
        auVar80._4_4_ =
             (int)(float)((~-(uint)((int)local_398._4_4_ < 8) & UNORM_SHORT_565 |
                          local_398._4_4_ & -(uint)((int)local_398._4_4_ < 8)) * 0x800000 +
                         DAT_01a25ce0._4_4_);
        auVar80._8_4_ =
             (int)(float)((~-(uint)((int)(float)uStack_390 < 8) & 8 |
                          (uint)(float)uStack_390 & -(uint)((int)(float)uStack_390 < 8)) * 0x800000
                         + DAT_01a25ce0._8_4_);
        auVar80._12_4_ =
             (int)(float)((~-(uint)((int)uStack_390._4_4_ < 8) & 8 |
                          (uint)uStack_390._4_4_ & -(uint)((int)uStack_390._4_4_ < 8)) * 0x800000 +
                         DAT_01a25ce0._12_4_);
        auVar91._4_4_ = auVar80._4_4_;
        auVar91._0_4_ = auVar80._4_4_;
        auVar91._8_4_ = auVar80._12_4_;
        auVar91._12_4_ = auVar80._12_4_;
        auVar81._0_4_ = (float)(int)(-auVar80._0_4_ ^ 0xffffffff);
        auVar81._4_4_ = (float)(int)(-auVar80._4_4_ ^ 0xffffffff);
        auVar81._8_4_ = (float)(int)((uint)((auVar80._8_8_ & 0xffffffff) * 0xffffffff) ^ 0xffffffff)
        ;
        auVar81._12_4_ =
             (float)(int)((uint)((auVar91._8_8_ & 0xffffffff) * 0xffffffff) ^ 0xffffffff);
        afVar92 = (float  [4])divps(_DAT_01a25ce0,auVar81);
        local_398._0_4_ = afVar92[0];
        local_398._4_4_ = afVar92[1];
        uStack_390._0_4_ = afVar92[2];
        uStack_390._4_4_ = afVar92[3];
        local_4a8._8_8_ = 0x4000000040000000;
        local_4a8._0_8_ = 0x4000000040000000;
        local_578.m_data = (float  [4])ZEXT816(0);
        pMVar44 = (MessageBuilder *)local_4a8;
        lVar49 = 0;
        do {
          pMVar55 = this_01;
          if (*(char *)((long)&local_544 + lVar49) == '\0') {
            pMVar55 = pMVar44;
          }
          local_578.m_data[lVar49] = *(float *)&pMVar55->m_log;
          lVar49 = lVar49 + 1;
          pMVar44 = (MessageBuilder *)((long)&pMVar44->m_log + 4);
          this_01 = (MessageBuilder *)((long)&this_01->m_log + 4);
        } while (lVar49 != 4);
        bVar20 = tcu::floatThresholdCompare
                           (local_488,(char *)local_598.m_data._0_8_,(char *)local_5e8.m_data._0_8_,
                            (ConstPixelBufferAccess *)local_5c8,(ConstPixelBufferAccess *)local_1c8,
                            &local_578,COMPARE_LOG_RESULT);
      }
      else {
        if (TVar22 != TEXTURECHANNELCLASS_FLOATING_POINT) {
          pTVar40 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar40,"Unsupported comparison",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                     ,0x3b4);
          __cxa_throw(pTVar40,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        CVar63 = (format->format).type;
        if (CVar63 == UNSIGNED_INT_11F_11F_10F_REV) {
          uVar50 = 0x20000;
          uVar25 = 0x20000;
          uVar67 = 0x40000;
          uVar68 = 0;
        }
        else {
          uVar50 = 0;
          uVar25 = 0;
          uVar67 = 0;
          uVar68 = 0;
          if (CVar63 == HALF_FLOAT) {
            uVar50 = 0x2000;
            uVar25 = 0x2000;
            uVar67 = 0x2000;
            uVar68 = 0x2000;
          }
        }
        uVar69 = 4;
        if (local_518._0_4_ == 1) {
          uVar69 = 0x2000;
        }
        if (local_518._0_4_ == 0) {
          uVar69 = 0x8000;
        }
        uVar100 = -(uint)((int)(uVar69 | 0x80000000) < (int)(uVar50 ^ 0x80000000));
        uVar101 = -(uint)((int)(uVar69 | 0x80000000) < (int)(uVar25 ^ 0x80000000));
        uVar102 = -(uint)((int)(uVar69 | 0x80000000) < (int)(uVar67 ^ 0x80000000));
        uVar103 = -(uint)((int)(uVar69 | 0x80000000) < (int)(uVar68 ^ 0x80000000));
        local_4a8._4_4_ = ~uVar101 & uVar69 | uVar25 & uVar101;
        local_4a8._0_4_ = ~uVar100 & uVar69 | uVar50 & uVar100;
        local_4a8._8_4_ = ~uVar102 & uVar69 | uVar67 & uVar102;
        local_4a8._12_4_ = ~uVar103 & uVar69 | uVar68 & uVar103;
        local_1e8 = -NAN;
        iStack_1e4 = -1;
        iStack_1e0 = -1;
        iStack_1dc = -1;
        local_578.m_data[0] = 0.0;
        local_578.m_data[1] = 0.0;
        local_578.m_data[2] = 0.0;
        local_578.m_data[3] = 0.0;
        pfVar39 = (float *)local_4a8;
        pfVar45 = &local_1e8;
        lVar49 = 0;
        do {
          pfVar56 = pfVar45;
          if (*(char *)((long)&local_544 + lVar49) != '\0') {
            pfVar56 = pfVar39;
          }
          local_578.m_data[lVar49] = *pfVar56;
          lVar49 = lVar49 + 1;
          pfVar45 = pfVar45 + 1;
          pfVar39 = pfVar39 + 1;
        } while (lVar49 != 4);
        local_398._0_4_ = local_578.m_data[0];
        local_398._4_4_ = local_578.m_data[1];
        uStack_390._0_4_ = local_578.m_data[2];
        uStack_390._4_4_ = local_578.m_data[3];
        bVar20 = tcu::floatUlpThresholdCompare
                           (local_488,(char *)local_598.m_data._0_8_,(char *)local_5e8.m_data._0_8_,
                            (ConstPixelBufferAccess *)local_5c8,(ConstPixelBufferAccess *)local_1c8,
                            (UVec4 *)this_01,COMPARE_LOG_RESULT);
      }
      if ((undefined1 *)local_5e8.m_data._0_8_ != local_5d8) {
        operator_delete((void *)local_5e8.m_data._0_8_,local_5d8._0_8_ + 1);
      }
      if ((undefined1 *)local_598.m_data._0_8_ != local_588) {
        operator_delete((void *)local_598.m_data._0_8_,local_588._0_8_ + 1);
      }
      bVar41 = bVar41 & bVar20;
      uVar48 = uVar48 + 1;
    } while (uVar48 != local_4d0);
    testResult = (qpTestResult)(bVar41 ^ 1);
    description = "Image comparison failed";
    if (bVar41 != 0) {
      description = "Pass";
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::AttachmentData>_>
  ::~vector(&local_478);
  if (local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_218.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_218.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_3c8);
  return STOP;
}

Assistant:

FragmentOutputCase::IterateResult FragmentOutputCase::iterate (void)
{
	TestLog&					log					= m_testCtx.getLog();
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();

	// Compute grid size & index list.
	const int					minCellSize			= 8;
	const IVec2					minBufSize			= getMinSize(m_fboSpec);
	const int					gridWidth			= de::clamp(minBufSize.x()/minCellSize, 1, 255)+1;
	const int					gridHeight			= de::clamp(minBufSize.y()/minCellSize, 1, 255)+1;
	const int					numVertices			= gridWidth*gridHeight;
	const int					numQuads			= (gridWidth-1)*(gridHeight-1);
	const int					numIndices			= numQuads*6;

	const int					numInputVecs		= getNumInputVectors(m_outputs);
	vector<vector<deUint32> >	inputs				(numInputVecs);
	vector<float>				positions			(numVertices*4);
	vector<deUint16>			indices				(numIndices);

	const int					readAlignment		= 4;
	const int					viewportW			= minBufSize.x();
	const int					viewportH			= minBufSize.y();
	const int					numAttachments		= (int)m_fboSpec.size();

	vector<deUint32>			drawBuffers			(numAttachments);
	vector<AttachmentData>		attachments			(numAttachments);

	// Initialize attachment data.
	for (int ndx = 0; ndx < numAttachments; ndx++)
	{
		const tcu::TextureFormat		texFmt			= glu::mapGLInternalFormat(m_fboSpec[ndx].format);
		const tcu::TextureChannelClass	chnClass		= tcu::getTextureChannelClass(texFmt.type);
		const bool						isFixedPoint	= chnClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT ||
														  chnClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT;

		// \note Fixed-point formats use float reference to enable more accurate result verification.
		const tcu::TextureFormat		refFmt			= isFixedPoint ? tcu::TextureFormat(texFmt.order, tcu::TextureFormat::FLOAT) : texFmt;
		const tcu::TextureFormat		readFmt			= getFramebufferReadFormat(texFmt);
		const int						attachmentW		= m_fboSpec[ndx].width;
		const int						attachmentH		= m_fboSpec[ndx].height;

		drawBuffers[ndx]					= GL_COLOR_ATTACHMENT0+ndx;
		attachments[ndx].format				= texFmt;
		attachments[ndx].readFormat			= readFmt;
		attachments[ndx].referenceFormat	= refFmt;
		attachments[ndx].renderedData.resize(readFmt.getPixelSize()*attachmentW*attachmentH);
		attachments[ndx].referenceData.resize(refFmt.getPixelSize()*attachmentW*attachmentH);
	}

	// Initialize indices.
	for (int quadNdx = 0; quadNdx < numQuads; quadNdx++)
	{
		int	quadY	= quadNdx / (gridWidth-1);
		int quadX	= quadNdx - quadY*(gridWidth-1);

		indices[quadNdx*6+0] = deUint16(quadX + quadY*gridWidth);
		indices[quadNdx*6+1] = deUint16(quadX + (quadY+1)*gridWidth);
		indices[quadNdx*6+2] = deUint16(quadX + quadY*gridWidth + 1);
		indices[quadNdx*6+3] = indices[quadNdx*6+1];
		indices[quadNdx*6+4] = deUint16(quadX + (quadY+1)*gridWidth + 1);
		indices[quadNdx*6+5] = indices[quadNdx*6+2];
	}

	for (int y = 0; y < gridHeight; y++)
	{
		for (int x = 0; x < gridWidth; x++)
		{
			float	xf	= (float)x / (float)(gridWidth-1);
			float	yf	= (float)y / (float)(gridHeight-1);

			positions[(y*gridWidth + x)*4 + 0] = 2.0f*xf - 1.0f;
			positions[(y*gridWidth + x)*4 + 1] = 2.0f*yf - 1.0f;
			positions[(y*gridWidth + x)*4 + 2] = 0.0f;
			positions[(y*gridWidth + x)*4 + 3] = 1.0f;
		}
	}

	// Initialize input vectors.
	{
		int curInVec = 0;
		for (int outputNdx = 0; outputNdx < (int)m_outputs.size(); outputNdx++)
		{
			const FragmentOutput&	output		= m_outputs[outputNdx];
			bool					isFloat		= glu::isDataTypeFloatOrVec(output.type);
			bool					isInt		= glu::isDataTypeIntOrIVec(output.type);
			bool					isUint		= glu::isDataTypeUintOrUVec(output.type);
			int						numVecs		= output.arrayLength > 0 ? output.arrayLength : 1;
			int						numScalars	= glu::getDataTypeScalarSize(output.type);

			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				inputs[curInVec].resize(numVertices*numScalars);

				// Record how many outputs are written in attachment.
				DE_ASSERT(output.location+vecNdx < (int)attachments.size());
				attachments[output.location+vecNdx].numWrittenChannels	= numScalars;
				attachments[output.location+vecNdx].outPrecision		= output.precision;

				if (isFloat)
				{
					Vec2		range	= getFloatRange(output.precision);
					Vec4		minVal	(range.x());
					Vec4		maxVal	(range.y());
					float*		dst		= (float*)&inputs[curInVec][0];

					if (de::inBounds(output.location+vecNdx, 0, (int)attachments.size()))
					{
						// \note Floating-point precision conversion is not well-defined. For that reason we must
						//       limit value range to intersection of both data type and render target value ranges.
						const tcu::TextureFormatInfo fmtInfo = tcu::getTextureFormatInfo(attachments[output.location+vecNdx].format);
						minVal = tcu::max(minVal, fmtInfo.valueMin);
						maxVal = tcu::min(maxVal, fmtInfo.valueMax);
					}

					m_testCtx.getLog() << TestLog::Message << "out" << curInVec << " value range: " << valueRangeToString(numScalars, minVal, maxVal) << TestLog::EndMessage;

					for (int y = 0; y < gridHeight; y++)
					{
						for (int x = 0; x < gridWidth; x++)
						{
							float	xf	= (float)x / (float)(gridWidth-1);
							float	yf	= (float)y / (float)(gridHeight-1);

							float	f0	= (xf + yf) * 0.5f;
							float	f1	= 0.5f + (xf - yf) * 0.5f;
							Vec4	f	= swizzleVec(Vec4(f0, f1, 1.0f-f0, 1.0f-f1), curInVec);
							Vec4	c	= minVal + (maxVal-minVal)*f;
							float*	v	= dst + (y*gridWidth + x)*numScalars;

							for (int ndx = 0; ndx < numScalars; ndx++)
								v[ndx] = c[ndx];
						}
					}
				}
				else if (isInt)
				{
					const IVec2	range	= getIntRange(output.precision);
					IVec4		minVal	(range.x());
					IVec4		maxVal	(range.y());

					if (de::inBounds(output.location+vecNdx, 0, (int)attachments.size()))
					{
						// Limit to range of output format as conversion mode is not specified.
						const IVec4 fmtBits		= tcu::getTextureFormatBitDepth(attachments[output.location+vecNdx].format);
						const BVec4	isZero		= lessThanEqual(fmtBits, IVec4(0));
						const IVec4	fmtMinVal	= (-(tcu::Vector<deInt64, 4>(1) << (fmtBits-1).cast<deInt64>())).asInt();
						const IVec4	fmtMaxVal	= ((tcu::Vector<deInt64, 4>(1) << (fmtBits-1).cast<deInt64>())-deInt64(1)).asInt();

						minVal = select(minVal, tcu::max(minVal, fmtMinVal), isZero);
						maxVal = select(maxVal, tcu::min(maxVal, fmtMaxVal), isZero);
					}

					m_testCtx.getLog() << TestLog::Message << "out" << curInVec << " value range: " << valueRangeToString(numScalars, minVal, maxVal) << TestLog::EndMessage;

					const IVec4	rangeDiv	= swizzleVec((IVec4(gridWidth, gridHeight, gridWidth, gridHeight)-1), curInVec);
					const IVec4	step		= ((maxVal.cast<deInt64>() - minVal.cast<deInt64>()) / (rangeDiv.cast<deInt64>())).asInt();
					deInt32*	dst			= (deInt32*)&inputs[curInVec][0];

					for (int y = 0; y < gridHeight; y++)
					{
						for (int x = 0; x < gridWidth; x++)
						{
							int			ix	= gridWidth - x - 1;
							int			iy	= gridHeight - y - 1;
							IVec4		c	= minVal + step*swizzleVec(IVec4(x, y, ix, iy), curInVec);
							deInt32*	v	= dst + (y*gridWidth + x)*numScalars;

							DE_ASSERT(boolAll(logicalAnd(greaterThanEqual(c, minVal), lessThanEqual(c, maxVal))));

							for (int ndx = 0; ndx < numScalars; ndx++)
								v[ndx] = c[ndx];
						}
					}
				}
				else if (isUint)
				{
					const UVec2	range	= getUintRange(output.precision);
					UVec4		maxVal	(range.y());

					if (de::inBounds(output.location+vecNdx, 0, (int)attachments.size()))
					{
						// Limit to range of output format as conversion mode is not specified.
						const IVec4	fmtBits		= tcu::getTextureFormatBitDepth(attachments[output.location+vecNdx].format);
						const UVec4	fmtMaxVal	= ((tcu::Vector<deUint64, 4>(1) << fmtBits.cast<deUint64>())-deUint64(1)).asUint();

						maxVal = tcu::min(maxVal, fmtMaxVal);
					}

					m_testCtx.getLog() << TestLog::Message << "out" << curInVec << " value range: "  << valueRangeToString(numScalars, UVec4(0), maxVal) << TestLog::EndMessage;

					const IVec4	rangeDiv	= swizzleVec((IVec4(gridWidth, gridHeight, gridWidth, gridHeight)-1), curInVec);
					const UVec4	step		= maxVal / rangeDiv.asUint();
					deUint32*	dst			= &inputs[curInVec][0];

					DE_ASSERT(range.x() == 0);

					for (int y = 0; y < gridHeight; y++)
					{
						for (int x = 0; x < gridWidth; x++)
						{
							int			ix	= gridWidth - x - 1;
							int			iy	= gridHeight - y - 1;
							UVec4		c	= step*swizzleVec(IVec4(x, y, ix, iy).asUint(), curInVec);
							deUint32*	v	= dst + (y*gridWidth + x)*numScalars;

							DE_ASSERT(boolAll(lessThanEqual(c, maxVal)));

							for (int ndx = 0; ndx < numScalars; ndx++)
								v[ndx] = c[ndx];
						}
					}
				}
				else
					DE_ASSERT(false);

				curInVec += 1;
			}
		}
	}

	// Render using gl.
	gl.useProgram(m_program->getProgram());
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
	gl.viewport(0, 0, viewportW, viewportH);
	gl.drawBuffers((int)drawBuffers.size(), &drawBuffers[0]);
	gl.disable(GL_DITHER); // Dithering causes issues with unorm formats. Those issues could be worked around in threshold, but it makes validation less accurate.
	GLU_EXPECT_NO_ERROR(gl.getError(), "After program setup");

	{
		int curInVec = 0;
		for (int outputNdx = 0; outputNdx < (int)m_outputs.size(); outputNdx++)
		{
			const FragmentOutput&	output			= m_outputs[outputNdx];
			bool					isArray			= output.arrayLength > 0;
			bool					isFloat			= glu::isDataTypeFloatOrVec(output.type);
			bool					isInt			= glu::isDataTypeIntOrIVec(output.type);
			bool					isUint			= glu::isDataTypeUintOrUVec(output.type);
			int						scalarSize		= glu::getDataTypeScalarSize(output.type);
			deUint32				glScalarType	= isFloat	? GL_FLOAT			:
													  isInt		? GL_INT			:
													  isUint	? GL_UNSIGNED_INT	: GL_NONE;
			int						numVecs			= isArray ? output.arrayLength : 1;

			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				string	name	= string("in") + de::toString(outputNdx) + (isArray ? string("_") + de::toString(vecNdx) : string());
				int		loc		= gl.getAttribLocation(m_program->getProgram(), name.c_str());

				if (loc >= 0)
				{
					gl.enableVertexAttribArray(loc);
					if (isFloat)
						gl.vertexAttribPointer(loc, scalarSize, glScalarType, GL_FALSE, 0, &inputs[curInVec][0]);
					else
						gl.vertexAttribIPointer(loc, scalarSize, glScalarType, 0, &inputs[curInVec][0]);
				}
				else
					log << TestLog::Message << "Warning: No location for attribute '" << name << "' found." << TestLog::EndMessage;

				curInVec += 1;
			}
		}
	}
	{
		int posLoc = gl.getAttribLocation(m_program->getProgram(), "a_position");
		TCU_CHECK(posLoc >= 0);
		gl.enableVertexAttribArray(posLoc);
		gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &positions[0]);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "After attribute setup");

	gl.drawElements(GL_TRIANGLES, numIndices, GL_UNSIGNED_SHORT, &indices[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawElements");

	// Read all attachment points.
	for (int ndx = 0; ndx < numAttachments; ndx++)
	{
		const glu::TransferFormat		transferFmt			= glu::getTransferFormat(attachments[ndx].readFormat);
		void*							dst					= &attachments[ndx].renderedData[0];
		const int						attachmentW			= m_fboSpec[ndx].width;
		const int						attachmentH			= m_fboSpec[ndx].height;
		const int						numValidChannels	= attachments[ndx].numWrittenChannels;
		const tcu::PixelBufferAccess	rendered			(attachments[ndx].readFormat, attachmentW, attachmentH, 1, deAlign32(attachments[ndx].readFormat.getPixelSize()*attachmentW, readAlignment), 0, &attachments[ndx].renderedData[0]);

		gl.readBuffer(GL_COLOR_ATTACHMENT0+ndx);
		gl.readPixels(0, 0, minBufSize.x(), minBufSize.y(), transferFmt.format, transferFmt.dataType, dst);

		clearUndefined(rendered, numValidChannels);
	}

	// Render reference images.
	{
		int curInNdx = 0;
		for (int outputNdx = 0; outputNdx < (int)m_outputs.size(); outputNdx++)
		{
			const FragmentOutput&	output			= m_outputs[outputNdx];
			const bool				isArray			= output.arrayLength > 0;
			const bool				isFloat			= glu::isDataTypeFloatOrVec(output.type);
			const bool				isInt			= glu::isDataTypeIntOrIVec(output.type);
			const bool				isUint			= glu::isDataTypeUintOrUVec(output.type);
			const int				scalarSize		= glu::getDataTypeScalarSize(output.type);
			const int				numVecs			= isArray ? output.arrayLength : 1;

			for (int vecNdx = 0; vecNdx < numVecs; vecNdx++)
			{
				const int		location	= output.location+vecNdx;
				const void*		inputData	= &inputs[curInNdx][0];

				DE_ASSERT(de::inBounds(location, 0, (int)m_fboSpec.size()));

				const int						bufW			= m_fboSpec[location].width;
				const int						bufH			= m_fboSpec[location].height;
				const tcu::PixelBufferAccess	buf				(attachments[location].referenceFormat, bufW, bufH, 1, &attachments[location].referenceData[0]);
				const tcu::PixelBufferAccess	viewportBuf		= getSubregion(buf, 0, 0, 0, viewportW, viewportH, 1);

				if (isInt || isUint)
					renderIntReference(viewportBuf, gridWidth, gridHeight, scalarSize, (const int*)inputData);
				else if (isFloat)
					renderFloatReference(viewportBuf, gridWidth, gridHeight, scalarSize, (const float*)inputData);
				else
					DE_ASSERT(false);

				curInNdx += 1;
			}
		}
	}

	// Compare all images.
	bool allLevelsOk = true;
	for (int attachNdx = 0; attachNdx < numAttachments; attachNdx++)
	{
		const int						attachmentW			= m_fboSpec[attachNdx].width;
		const int						attachmentH			= m_fboSpec[attachNdx].height;
		const int						numValidChannels	= attachments[attachNdx].numWrittenChannels;
		const tcu::BVec4				cmpMask				(numValidChannels >= 1, numValidChannels >= 2, numValidChannels >= 3, numValidChannels >= 4);
		const glu::Precision			outPrecision		= attachments[attachNdx].outPrecision;
		const tcu::TextureFormat&		format				= attachments[attachNdx].format;
		tcu::ConstPixelBufferAccess		rendered			(attachments[attachNdx].readFormat, attachmentW, attachmentH, 1, deAlign32(attachments[attachNdx].readFormat.getPixelSize()*attachmentW, readAlignment), 0, &attachments[attachNdx].renderedData[0]);
		tcu::ConstPixelBufferAccess		reference			(attachments[attachNdx].referenceFormat, attachmentW, attachmentH, 1, &attachments[attachNdx].referenceData[0]);
		tcu::TextureChannelClass		texClass			= tcu::getTextureChannelClass(format.type);
		bool							isOk				= true;
		const string					name				= string("Attachment") + de::toString(attachNdx);
		const string					desc				= string("Color attachment ") + de::toString(attachNdx);

		log << TestLog::Message << "Attachment " << attachNdx << ": " << numValidChannels << " channels have defined values and used for comparison" << TestLog::EndMessage;

		switch (texClass)
		{
			case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			{
				const deUint32	interpThreshold		= 4;	//!< 4 ULP interpolation threshold (interpolation always in highp)
				deUint32		outTypeThreshold	= 0;	//!< Threshold based on output type
				UVec4			formatThreshold;			//!< Threshold computed based on format.
				UVec4			finalThreshold;

				// 1 ULP rounding error is allowed for smaller floating-point formats
				switch (format.type)
				{
					case tcu::TextureFormat::FLOAT:							formatThreshold = UVec4(0);											break;
					case tcu::TextureFormat::HALF_FLOAT:					formatThreshold = UVec4((1<<(23-10)));								break;
					case tcu::TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:	formatThreshold = UVec4((1<<(23-6)), (1<<(23-6)), (1<<(23-5)), 0);	break;
					default:
						DE_ASSERT(false);
						break;
				}

				// 1 ULP rounding error for highp -> output precision cast
				switch (outPrecision)
				{
					case glu::PRECISION_LOWP:		outTypeThreshold	= (1<<(23-8));	break;
					case glu::PRECISION_MEDIUMP:	outTypeThreshold	= (1<<(23-10));	break;
					case glu::PRECISION_HIGHP:		outTypeThreshold	= 0;			break;
					default:
						DE_ASSERT(false);
				}

				finalThreshold = select(max(formatThreshold, UVec4(deMax32(interpThreshold, outTypeThreshold))), UVec4(~0u), cmpMask);

				isOk = tcu::floatUlpThresholdCompare(log, name.c_str(), desc.c_str(), reference, rendered, finalThreshold, tcu::COMPARE_LOG_RESULT);
				break;
			}

			case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			{
				// \note glReadPixels() allows only 8 bits to be read. This means that RGB10_A2 will loose some
				// bits in the process and it must be taken into account when computing threshold.
				const IVec4		bits			= min(IVec4(8), tcu::getTextureFormatBitDepth(format));
				const Vec4		baseThreshold	= 1.0f / ((IVec4(1) << bits)-1).asFloat();
				const Vec4		threshold		= select(baseThreshold, Vec4(2.0f), cmpMask);

				isOk = tcu::floatThresholdCompare(log, name.c_str(), desc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT);
				break;
			}

			case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			{
				const tcu::UVec4 threshold = select(UVec4(0u), UVec4(~0u), cmpMask);
				isOk = tcu::intThresholdCompare(log, name.c_str(), desc.c_str(), reference, rendered, threshold, tcu::COMPARE_LOG_RESULT);
				break;
			}

			default:
				TCU_FAIL("Unsupported comparison");
				break;
		}

		if (!isOk)
			allLevelsOk = false;
	}

	m_testCtx.setTestResult(allLevelsOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							allLevelsOk ? "Pass"				: "Image comparison failed");
	return STOP;
}